

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1P3L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer src;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  RealScalar RVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar360;
  double dVar361;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  double dVar367;
  double dVar368;
  double dVar369;
  double dVar370;
  double dVar371;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar372;
  ostream *poVar373;
  long lVar374;
  long lVar375;
  int iVar376;
  pointer pMVar377;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar378;
  byte bVar379;
  undefined4 uVar380;
  undefined4 uVar381;
  undefined4 uVar382;
  undefined4 uVar383;
  undefined4 uVar384;
  undefined4 uVar385;
  undefined4 uVar386;
  undefined4 uVar387;
  undefined4 uVar388;
  undefined4 uVar389;
  uint uVar390;
  undefined4 uVar391;
  uint uVar392;
  uint uVar393;
  undefined4 uVar394;
  undefined4 uVar395;
  uint uVar396;
  undefined4 uVar397;
  uint uVar398;
  undefined4 uVar399;
  uint uVar400;
  double dVar401;
  double dVar402;
  double dVar403;
  double dVar404;
  double dVar405;
  double dVar406;
  double dVar407;
  double dVar408;
  double dVar409;
  double dVar410;
  double dVar411;
  double dVar412;
  double dVar413;
  double dVar414;
  double dVar415;
  double dVar416;
  double dVar417;
  double dVar418;
  double dVar419;
  double dVar420;
  double dVar421;
  double dVar422;
  double dVar423;
  double dVar424;
  double dVar425;
  double dVar426;
  double dVar427;
  double dVar428;
  double dVar429;
  double dVar430;
  undefined4 uVar431;
  undefined4 uVar432;
  uint uVar433;
  undefined4 uVar434;
  undefined4 uVar435;
  undefined4 uVar436;
  double dVar437;
  double dVar438;
  double dVar439;
  double dVar440;
  double dVar441;
  double dVar442;
  double dVar454;
  double dVar455;
  undefined1 auVar456 [16];
  double dVar443;
  double dVar444;
  double dVar445;
  double dVar446;
  double dVar447;
  double dVar448;
  double dVar449;
  double dVar450;
  double dVar451;
  double dVar452;
  double dVar453;
  double dVar459;
  double dVar460;
  double dVar461;
  double dVar462;
  double dVar463;
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  double dVar464;
  double dVar465;
  double dVar466;
  double dVar467;
  double dVar468;
  double dVar469;
  double dVar470;
  double dVar471;
  double dVar472;
  double dVar473;
  double dVar474;
  double dVar475;
  double dVar476;
  double dVar477;
  double dVar478;
  double dVar479;
  double dVar480;
  double dVar481;
  double dVar482;
  double dVar483;
  double dVar484;
  double dVar485;
  double dVar486;
  double dVar487;
  double dVar488;
  double dVar489;
  double dVar490;
  double dVar491;
  double dVar492;
  double dVar493;
  double dVar494;
  double dVar495;
  double dVar496;
  double dVar497;
  double dVar498;
  double dVar499;
  double dVar500;
  double dVar501;
  double dVar502;
  double dVar503;
  double dVar504;
  double dVar505;
  double dVar506;
  double dVar507;
  double dVar508;
  double dVar509;
  double dVar510;
  double dVar511;
  double dVar512;
  double dVar513;
  double dVar514;
  double dVar515;
  double dVar516;
  double dVar517;
  double dVar518;
  double dVar519;
  double dVar520;
  double dVar521;
  double dVar522;
  double dVar523;
  double dVar524;
  double dVar525;
  double dVar526;
  double dVar527;
  double dVar528;
  double dVar529;
  double dVar530;
  double dVar531;
  double dVar532;
  double dVar533;
  double dVar534;
  double dVar535;
  double dVar536;
  double dVar537;
  double dVar538;
  double dVar539;
  double dVar540;
  double dVar541;
  double dVar542;
  double dVar543;
  double dVar544;
  double dVar545;
  double dVar546;
  double dVar547;
  double dVar548;
  double dVar549;
  undefined4 uVar550;
  undefined4 uVar551;
  double dVar552;
  double dVar553;
  double dVar554;
  double dVar555;
  double dVar556;
  double dVar557;
  double dVar558;
  double dVar559;
  double dVar560;
  double dVar561;
  double dVar562;
  double dVar563;
  double dVar564;
  double dVar565;
  double dVar566;
  double dVar567;
  double dVar568;
  double dVar569;
  double dVar570;
  double dVar571;
  double dVar572;
  ulong uVar573;
  double dVar574;
  double dVar575;
  double dVar576;
  double dVar577;
  double dVar578;
  double dVar579;
  double dVar580;
  ulong uVar581;
  double dVar582;
  double dVar583;
  double dVar584;
  double dVar585;
  double dVar586;
  double dVar587;
  double dVar588;
  double dVar589;
  double dVar590;
  double dVar591;
  double dVar592;
  double dVar593;
  undefined4 uVar594;
  double dStack_1f20;
  double dStack_1ef0;
  double dStack_1ee0;
  double local_1ec8;
  undefined8 uStack_1ec0;
  double dStack_1e90;
  double dStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  double dStack_1e50;
  double dStack_1e30;
  double dStack_1e20;
  double dStack_1e00;
  double dStack_1df0;
  double dStack_1db0;
  double dStack_1d80;
  double dStack_1d70;
  double dStack_1d60;
  double dStack_1d40;
  double dStack_1d10;
  double dStack_1d00;
  double dStack_1cf0;
  double dStack_1ce0;
  double dStack_1cd0;
  double local_1cb8;
  undefined8 uStack_1cb0;
  double dStack_1ca0;
  double dStack_1c80;
  double dStack_1c70;
  double dStack_1c50;
  double local_1c48;
  undefined8 uStack_1c40;
  double dStack_1c20;
  double dStack_1c10;
  double dStack_1bd0;
  double dStack_1bb0;
  double dStack_1ba0;
  double dStack_1b80;
  double dStack_1b70;
  double dStack_1b60;
  double dStack_1b50;
  double dStack_1b40;
  double dStack_1b30;
  double dStack_1b20;
  double dStack_1b10;
  double dStack_1b00;
  double dStack_1af0;
  double dStack_1ad0;
  double dStack_1ac0;
  double dStack_1a50;
  double dStack_1a30;
  double dStack_1a20;
  double dStack_1a10;
  double dStack_1a00;
  double local_19b8;
  undefined8 uStack_19b0;
  double dStack_19a0;
  double dStack_1990;
  double dStack_1980;
  double dStack_1950;
  double dStack_1930;
  double dStack_1920;
  double dStack_1910;
  double dStack_1900;
  double dStack_18f0;
  double dStack_18e0;
  double dStack_18c0;
  double dStack_1890;
  double dStack_1880;
  double local_1868;
  undefined8 uStack_1860;
  double dStack_1840;
  double dStack_1800;
  double dStack_17f0;
  double dStack_17e0;
  double dStack_17d0;
  double dStack_17c0;
  double dStack_1790;
  double dStack_1780;
  double dStack_1770;
  double dStack_1750;
  double local_1748;
  undefined8 uStack_1740;
  double dStack_1720;
  double dStack_1710;
  double dStack_1700;
  double dStack_16c0;
  double dStack_16a0;
  double dStack_1680;
  double dStack_1670;
  double dStack_1660;
  double dStack_1650;
  double dStack_1640;
  double dStack_1630;
  double dStack_1610;
  double local_15f8;
  undefined8 uStack_15f0;
  double dStack_15e0;
  double dStack_15c0;
  double dStack_15b0;
  double dStack_1590;
  double dStack_1570;
  double dStack_1560;
  double dStack_1500;
  double dStack_14e0;
  double dStack_14b0;
  double dStack_14a0;
  double dStack_1490;
  double local_1488;
  undefined4 uStack_1480;
  undefined4 uStack_147c;
  double dStack_1450;
  double dStack_1440;
  double dStack_1430;
  double dStack_1410;
  double local_1408;
  undefined8 uStack_1400;
  double dStack_13f0;
  double dStack_13e0;
  double dStack_13d0;
  double dStack_13c0;
  undefined4 uStack_13a0;
  undefined4 uStack_139c;
  double dStack_1380;
  double dStack_1370;
  double dStack_1360;
  vector<double,_std::allocator<double>_> realRoots;
  double dStack_12f0;
  double dStack_12b0;
  double dStack_12a0;
  double dStack_1280;
  double dStack_1270;
  double dStack_1260;
  double dStack_1220;
  double dStack_11a0;
  double dStack_1190;
  double dStack_1170;
  double dStack_1160;
  double dStack_1150;
  double dStack_1120;
  double dStack_1100;
  double dStack_1070;
  double dStack_1060;
  double dStack_fe0;
  double dStack_fd0;
  double dStack_fb0;
  double dStack_f90;
  double dStack_f80;
  double dStack_f20;
  double dStack_ed0;
  double dStack_eb0;
  Scalar local_e88;
  Scalar local_e80;
  Scalar local_e78;
  Scalar local_e70;
  Scalar local_e68;
  Scalar local_e60;
  Scalar local_e58;
  Scalar local_e50;
  Scalar local_e48;
  Scalar local_e40;
  double local_e38;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_e30;
  double b;
  double local_e08;
  double ty;
  double tx;
  Matrix<double,_3,_1,_0,_3,_1> D1;
  Matrix<double,_6,_1,_0,_6,_1> v3;
  Matrix<double,_6,_1,_0,_6,_1> u1;
  double dStack_d30;
  double dStack_d20;
  undefined4 uStack_d10;
  undefined4 uStack_d0c;
  double dStack_d00;
  double dStack_ce0;
  Matrix<double,_4,_4,_0,_4,_4> transOut;
  Matrix<double,_6,_1,_0,_6,_1> u3;
  Matrix<double,_6,_1,_0,_6,_1> v2;
  Matrix<double,_6,_1,_0,_6,_1> u2;
  Matrix<double,_6,_1,_0,_6,_1> v1;
  Matrix<double,_6,_6,_0,_6,_6> TL;
  double dStack_990;
  double dStack_880;
  double dStack_870;
  double dStack_860;
  double dStack_840;
  double dStack_810;
  double dStack_7b0;
  double dStack_790;
  double dStack_780;
  double dStack_770;
  double dStack_760;
  double dStack_750;
  double dStack_730;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_6f0;
  Matrix<double,_6,_6,_0,_6,_6> TK;
  Matrix<double,_4,_1,_0,_4,_1> Q32;
  Matrix<double,_4,_1,_0,_4,_1> Q31;
  Matrix<double,_4,_1,_0,_4,_1> P32;
  Matrix<double,_4,_1,_0,_4,_1> P31;
  Matrix<double,_4,_1,_0,_4,_1> Q22;
  Matrix<double,_4,_1,_0,_4,_1> Q21;
  Matrix<double,_4,_1,_0,_4,_1> P22;
  Matrix<double,_4,_1,_0,_4,_1> P21;
  Matrix<double,_3,_1,_0,_3,_1> local_4b0;
  Matrix<double,_3,_1,_0,_3,_1> local_498;
  Matrix<double,_3,_1,_0,_3,_1> tQ32;
  Matrix<double,_3,_1,_0,_3,_1> tQ31;
  Matrix<double,_3,_1,_0,_3,_1> tP32;
  Matrix<double,_3,_1,_0,_3,_1> tP31;
  Matrix<double,_3,_1,_0,_3,_1> tQ22;
  Matrix<double,_3,_1,_0,_3,_1> tQ21;
  Matrix<double,_3,_1,_0,_3,_1> tP22;
  Matrix<double,_3,_1,_0,_3,_1> tP21;
  Matrix<double,_3,_1,_0,_3,_1> tQ12;
  Matrix<double,_3,_1,_0,_3,_1> tQ11;
  Matrix<double,_3,_1,_0,_3,_1> tP11;
  Matrix<double,_4,_1,_0,_4,_1> Q12;
  Matrix<double,_4,_1,_0,_4,_1> Q11;
  Matrix<double,_4,_1,_0,_4,_1> P12;
  Matrix<double,_4,_1,_0,_4,_1> P11;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  Matrix<double,_3,_1,_0,_3,_1> tP12;
  Matrix<double,_4,_1,_0,_4,_1> local_a8;
  Matrix<double,_4,_1,_0,_4,_1> local_88;
  Matrix<double,_6,_1,_0,_6,_1> L32;
  
  bVar379 = 0;
  src = (plPair->
        super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (((plPair->
       super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish != src) &&
     (0x100 < (ulong)((long)(lPair->
                            super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(lPair->
                           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start))) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Pi,&src->first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Nu,&((plPair->
                     super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P11,(Matrix<double,_4,_1,_0,_4,_1> *)
                    (lPair->
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P12,&(((lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->first).second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q11,&(((lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->second).first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q12,&(((lPair->
                       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->second).second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P21,(Matrix<double,_4,_1,_0,_4,_1> *)
                    ((lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P22,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1].first.second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q21,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1].second.first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q22,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1].second.second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P31,(Matrix<double,_4,_1,_0,_4,_1> *)
                    ((lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 2));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&P32,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[2].first.second);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q31,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[2].second.first);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
              (&Q32,&(lPair->
                     super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[2].second.second);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               P11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P12,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               P12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q12,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P21,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               P21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P22,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               P22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q21,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q22,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P31,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               P31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&P32,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               P32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tP32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q31,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Q32,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,4,1>const>const>>
              (&tQ32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&tP11;
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tP12;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L11,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    dVar543 = tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._0_4_
         = SUB84(dVar543,0);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._4_4_
         = (int)((ulong)dVar543 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L11,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<double,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L11,3);
    RVar111 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &TL);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         RVar111;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L11,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tP22;
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&tP21;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L21,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    dVar543 = tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._0_4_
         = SUB84(dVar543,0);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._4_4_
         = (int)((ulong)dVar543 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L21,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<double,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L21,3);
    RVar111 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &TL);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         RVar111;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L21,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tP32;
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&tP31;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L31,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    dVar543 = tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._0_4_
         = SUB84(dVar543,0);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._4_4_
         = (int)((ulong)dVar543 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L31,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<double,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L31,3);
    RVar111 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &TL);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         RVar111;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L31,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tQ12;
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&tQ11;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L12,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    dVar543 = tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._0_4_
         = SUB84(dVar543,0);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._4_4_
         = (int)((ulong)dVar543 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L12,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<double,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L12,3);
    RVar111 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &TL);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         RVar111;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L12,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tQ22;
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&tQ21;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L22,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    dVar543 = tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._0_4_
         = SUB84(dVar543,0);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._4_4_
         = (int)((ulong)dVar543 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L22,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<double,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L22,3);
    RVar111 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &TL);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         RVar111;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L22,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&tQ32;
    TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&tQ31;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L32,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    dVar543 = tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] -
              tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._0_4_
         = SUB84(dVar543,0);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]._4_4_
         = (int)((ulong)dVar543 >> 0x20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L32,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<double,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L32,3);
    RVar111 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &TL);
    TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         RVar111;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&L32,(Scalar *)&TK);
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    getPredefinedTransformations1Plane3Line<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&local_6f0,&local_88,&local_a8,false);
    lVar375 = 0x10;
    pMVar377 = local_6f0._M_impl.super__Vector_impl_data._M_finish + -1;
    pMVar378 = &TV;
    for (lVar374 = lVar375; lVar374 != 0; lVar374 = lVar374 + -1) {
      (pMVar378->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
      array[0] = (pMVar377->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar377 = (pointer)((long)pMVar377 + ((ulong)bVar379 * -2 + 1) * 8);
      pMVar378 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar378 + ((ulong)bVar379 * -2 + 1) * 8);
    }
    local_6f0._M_impl.super__Vector_impl_data._M_finish =
         local_6f0._M_impl.super__Vector_impl_data._M_finish + -2;
    pMVar377 = local_6f0._M_impl.super__Vector_impl_data._M_finish;
    pMVar378 = &TU;
    for (; lVar375 != 0; lVar375 = lVar375 + -1) {
      (pMVar378->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
      array[0] = (pMVar377->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar377 = (pointer)((long)pMVar377 + ((ulong)bVar379 * -2 + 1) * 8);
      pMVar378 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar378 + ((ulong)bVar379 * -2 + 1) * 8);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero
              ((ConstantReturnType *)&transOut,6,6);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,6,0,6,6>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              (&TL,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                    *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>((Type *)&u1,&TL,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&u1,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&u1,&TL,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&u1,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
         (double)CONCAT44(factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array[0]._4_4_,0xffffffff);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&u3,
                    &TU,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&u1,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&u3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_498,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&u1);
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&v1,&local_498);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&v3,(int *)&factors,(StorageBaseType *)&v1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&u2,&TU,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&transOut,(Lhs *)&v3,(Rhs *)&u2);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&v2,&TL,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&v2,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero
              ((ConstantReturnType *)&transOut,6,6);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,6,0,6,6>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              (&TK,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                    *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>((Type *)&u1,&TK,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&u1,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)&u1,&TK,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&u1,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
         (double)CONCAT44(factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array[0]._4_4_,0xffffffff);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&u3,
                    &TV,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&u1,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&u3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_4b0,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&u1);
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&v1,&local_4b0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&v3,(int *)&factors,(StorageBaseType *)&v1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&u2,&TV,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&transOut,(Lhs *)&v3,(Rhs *)&u2);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)&v2,&TK,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&v2,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)&L11;
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&TL;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&u1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)&L12;
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&TK;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&v1,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)&L21;
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&TL;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&u2,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)&L22;
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&TK;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&v2,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)&L31;
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&TL;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&u3,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&TK;
    transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)&L32;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              (&v3,(Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    dVar227 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5];
    dVar582 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * 4.0;
    dVar588 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * 2.0;
    dVar464 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * 4.0;
    dVar479 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * 2.0;
    dVar228 = dVar588 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar319 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
                    u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    auVar281._8_4_ =
         SUB84(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] * -dVar228,0);
    auVar281._0_8_ = dVar319;
    auVar281._12_4_ =
         (int)((ulong)(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * -dVar228) >> 0x20);
    dVar521 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] + u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar112 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * 4.0;
    auVar142._8_4_ = SUB84(dVar112,0);
    auVar142._0_8_ = dVar521;
    auVar142._12_4_ = (uint)((ulong)dVar112 >> 0x20) ^ 0x80000000;
    dVar113 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] + u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar229 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -dVar464 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar230 = dVar229 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    auVar362._8_4_ =
         SUB84(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] +
               u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4],0);
    auVar362._0_8_ = dVar113;
    auVar362._12_4_ =
         (int)((ulong)(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] +
                      u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]) >> 0x20);
    dVar128 = dVar113 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    auVar458._8_4_ = SUB84(dVar128,0);
    auVar458._0_8_ =
         dVar464 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar458._12_4_ = (int)((ulong)dVar128 >> 0x20);
    dVar437 = dVar128 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar401 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar437;
    dVar438 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar543 = dVar438 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar129 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar521 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar1._8_4_ = SUB84(dVar129,0);
    auVar1._0_8_ = dVar543;
    auVar1._12_4_ = (int)((ulong)dVar129 >> 0x20);
    dVar439 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar543 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    auVar143._8_4_ = SUB84(dVar401,0);
    auVar143._0_8_ = dVar230;
    auVar143._12_4_ = (uint)((ulong)dVar401 >> 0x20) ^ 0x80000000;
    dVar320 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5];
    dVar335 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar113;
    uVar399 = (undefined4)((ulong)dVar335 >> 0x20);
    dVar465 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] + u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5];
    dVar231 = -(dVar465 *
               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2]);
    local_1488 = dVar465 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[1];
    local_1c48 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5] *
                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
    dVar422 = local_1c48 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar552 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * local_1488 *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar561 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar422;
    dVar516 = dVar335 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar402 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    auVar282._8_4_ = SUB84(dVar335,0);
    auVar282._0_8_ = dVar320;
    auVar282._12_4_ = uVar399;
    dVar403 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar402;
    dVar129 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar130 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar521;
    auVar2._8_4_ = SUB84(dVar130,0);
    auVar2._0_8_ = dVar129;
    auVar2._12_4_ = (int)((ulong)dVar130 >> 0x20);
    dStack_1d70 = auVar458._8_8_;
    dVar440 = dVar464 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar336._8_4_ =
         SUB84(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar336._0_8_ =
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar336._12_4_ =
         (int)((ulong)u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] >> 0x20);
    dVar232 = dVar130 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar350._8_4_ =
         SUB84(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar350._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar350._12_4_ =
         (int)((ulong)v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] >> 0x20);
    dVar483 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar232;
    dVar275 = dStack_1d70 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    uVar385 = (undefined4)
              ((ulong)v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] >> 0x20);
    auVar3._8_4_ = SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1],0);
    auVar3._0_8_ = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
    auVar3._12_4_ = uVar385;
    dVar321 = dVar588 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar114 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] * dVar321;
    dVar404 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar321 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar115 = dVar114 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    auVar144._8_4_ = SUB84(dVar275,0);
    auVar144._0_8_ =
         dVar232 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
    auVar144._12_4_ = (int)((ulong)dVar275 >> 0x20);
    dVar233 = dVar232 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    uVar394 = SUB84(dVar275 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1],0);
    uVar396 = (uint)((ulong)(dVar275 *
                            v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[1]) >> 0x20);
    auVar145._8_4_ = uVar394;
    auVar145._0_8_ = dVar233;
    auVar145._12_4_ = uVar396;
    auVar146._8_4_ = SUB84(dVar404,0);
    auVar146._0_8_ = dVar233;
    auVar146._12_4_ = (int)((ulong)dVar404 >> 0x20);
    dStack_1ee0 = auVar362._8_8_;
    local_19b8 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[5] * dVar113;
    dVar423 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar113;
    dVar553 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar521;
    dVar562 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar113;
    dVar234 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3];
    dVar275 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar234 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar503 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar553 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    auVar4._8_4_ = SUB84(dVar503,0);
    auVar4._0_8_ = dVar275;
    auVar4._12_4_ = (uint)((ulong)dVar503 >> 0x20) ^ 0x80000000;
    dVar113 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar113;
    dVar131 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dStack_1ee0;
    auVar5._8_4_ = SUB84(dVar131,0);
    auVar5._0_8_ = dVar113;
    auVar5._12_4_ = (int)((ulong)dVar131 >> 0x20);
    dStack_1b60 = auVar282._8_8_;
    dVar235 = dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar236 = dVar235 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar237 = dVar228 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar522 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * dStack_1b60;
    local_1868 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] * dStack_1b60 *
                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    dVar523 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * local_1868;
    auVar147._8_4_ = SUB84(dVar523,0);
    auVar147._0_8_ = dVar237;
    auVar147._12_4_ = (uint)((ulong)dVar523 >> 0x20) ^ 0x80000000;
    dVar575 = dVar227 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar132 = -(dVar521 *
               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5]) *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar363._8_4_ =
         SUB84(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar363._0_8_ =
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar363._12_4_ =
         (int)((ulong)u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] >> 0x20);
    auVar6._8_4_ = SUB84(dVar132,0);
    auVar6._0_8_ = dVar575;
    auVar6._12_4_ = (int)((ulong)dVar132 >> 0x20);
    dVar132 = -dVar575 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar559 = dVar553 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    uVar380 = SUB84(dVar559,0);
    uVar386 = (undefined4)((ulong)dVar559 >> 0x20);
    auVar7._8_4_ = uVar380;
    auVar7._0_8_ = dVar132;
    auVar7._12_4_ = uVar386;
    dVar559 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar116 = -dVar559;
    dVar405 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * 4.0;
    dVar420 = dVar405 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    local_1408 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1] * -dVar420;
    dVar117 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * local_1408 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar441 = dVar553 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar524 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar441 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    uVar381 = SUB84(dVar524,0);
    uVar390 = (uint)((ulong)dVar524 >> 0x20);
    auVar148._8_4_ = uVar381;
    auVar148._0_8_ = dVar116;
    auVar148._12_4_ = uVar390;
    auVar8._8_4_ = uVar381;
    auVar8._0_8_ = dVar117;
    auVar8._12_4_ = uVar390 ^ 0x80000000;
    dVar524 = dVar423 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar118 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar524;
    dVar133 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    dVar465 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    uVar381 = SUB84(dVar133,0);
    uVar387 = (undefined4)((ulong)dVar133 >> 0x20);
    auVar9._8_4_ = uVar381;
    auVar9._0_8_ = dVar118;
    auVar9._12_4_ = uVar387;
    dVar133 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * -(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] * dVar524);
    dVar554 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar231 *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    uVar382 = SUB84(dVar554,0);
    uVar388 = (undefined4)((ulong)dVar554 >> 0x20);
    auVar10._8_4_ = uVar382;
    auVar10._0_8_ = dVar133;
    auVar10._12_4_ = uVar388;
    uVar383 = SUB84(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1],0);
    uVar389 = (undefined4)
              ((ulong)v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] >> 0x20);
    auVar11._8_4_ = uVar383;
    auVar11._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar11._12_4_ = uVar389;
    dVar554 = dVar553 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar238 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar524;
    uVar384 = SUB84(dVar554,0);
    uVar390 = (uint)((ulong)dVar554 >> 0x20);
    auVar12._8_4_ = uVar384;
    auVar12._0_8_ = -dVar238;
    auVar12._12_4_ = uVar390;
    auVar149._8_4_ = uVar384;
    auVar149._0_8_ = dVar238;
    auVar149._12_4_ = uVar390 ^ 0x80000000;
    dVar239 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar228;
    auVar150._8_4_ =
         SUB84(-dVar113 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5],0);
    auVar150._0_8_ = dVar239;
    auVar150._12_4_ =
         (int)((ulong)(-dVar113 *
                      u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5]) >> 0x20);
    dStack_1910 = auVar142._8_8_;
    dVar554 = dVar521 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dStack_1910 = dStack_1910 *
                  u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    auVar13._8_4_ = SUB84(dStack_1910,0);
    auVar13._0_8_ = dVar554;
    auVar13._12_4_ = (int)((ulong)dStack_1910 >> 0x20);
    dStack_1b80 = auVar336._8_8_;
    dVar240 = dVar554 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar241 = dStack_1910 * dStack_1b80 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    auVar151._8_4_ =
         SUB84(dVar240 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4],0);
    auVar151._0_8_ = dVar241;
    auVar151._12_4_ =
         (int)((ulong)(dVar240 *
                      v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]) >> 0x20);
    uStack_19b0._0_4_ = SUB84(dVar423,0);
    uStack_19b0._4_4_ = (undefined4)((ulong)dVar423 >> 0x20);
    dVar119 = dVar423 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    dVar419 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar582;
    dVar488 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar588;
    auVar152._8_4_ = SUB84(dVar488,0);
    auVar152._0_8_ = dVar419;
    auVar152._12_4_ = (int)((ulong)dVar488 >> 0x20);
    auVar153._8_4_ = SUB84(dVar119,0);
    auVar153._0_8_ =
         dVar488 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
    auVar153._12_4_ = (uint)((ulong)dVar119 >> 0x20) ^ 0x80000000;
    dStack_1c20 = auVar281._8_8_;
    dVar484 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar319 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar274 = auVar350._8_8_;
    auVar14._8_4_ =
         SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar14._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    auVar14._12_4_ =
         (int)((ulong)v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] >> 0x20);
    dVar322 = dVar319 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar319 = dStack_1c20 * dVar274 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar283._8_4_ = SUB84(dVar319,0);
    auVar283._0_8_ = dVar322;
    auVar283._12_4_ = (int)((ulong)dVar319 >> 0x20);
    uVar594 = (undefined4)
              ((ulong)v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] >> 0x20);
    dVar319 = dVar335 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar284._8_4_ =
         SUB84(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0],0);
    auVar284._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar284._12_4_ =
         (int)((ulong)v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] >> 0x20);
    dVar485 = dVar582 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar496 = dStack_1ee0 *
              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar276 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar496 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1ef0 = auVar3._8_8_;
    dVar547 = dStack_1ef0 * dVar276;
    auVar154._8_4_ = SUB84(dVar276,0);
    auVar154._0_8_ = dVar319;
    auVar154._12_4_ = (uint)((ulong)dVar276 >> 0x20) ^ 0x80000000;
    dVar276 = dVar488 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    auVar15._8_4_ =
         SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3],0);
    auVar15._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    auVar15._12_4_ = uVar594;
    dVar525 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] * dVar276 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar120 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] * dVar276 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar526 = dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar155._8_4_ =
         SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5],0);
    auVar155._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar155._12_4_ =
         (int)((ulong)v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5] >> 0x20);
    dVar121 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * dVar526;
    dVar517 = auVar11._8_8_;
    dVar122 = dVar521 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar134 = local_19b8 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar16._8_4_ = SUB84(dVar134,0);
    auVar16._0_8_ = dVar122;
    auVar16._12_4_ = (int)((ulong)dVar134 >> 0x20);
    dVar242 = dVar121 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    auVar156._8_4_ =
         SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] * dVar134,0);
    auVar156._0_8_ = dVar242;
    auVar156._12_4_ =
         (int)((ulong)(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] * dVar134) >> 0x20);
    dVar134 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * 4.0 *
              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar406 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -dVar485;
    dVar243 = -dVar485 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dStack_1e90 = auVar5._8_8_;
    dVar504 = dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar518 = dVar496 * dStack_1b80;
    auVar157._8_4_ = SUB84(dVar518,0);
    auVar157._0_8_ = dVar243;
    auVar157._12_4_ = (int)((ulong)dVar518 >> 0x20);
    auVar17._8_4_ = uVar383;
    auVar17._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar17._12_4_ = uVar389;
    auVar18._8_4_ = uVar383;
    auVar18._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar18._12_4_ = uVar389;
    uVar384 = SUB84(dVar517 * dVar518,0);
    uVar391 = (undefined4)((ulong)(dVar517 * dVar518) >> 0x20);
    auVar19._8_4_ = uVar384;
    auVar19._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         dVar504;
    auVar19._12_4_ = uVar391;
    dVar518 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar244 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar123 = dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar245 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar123;
    dVar123 = dVar123 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5];
    dStack_1990 = auVar152._8_8_;
    dStack_1990 = dStack_1990 *
                  u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    auVar158._8_4_ = SUB84(dStack_1990,0);
    auVar158._0_8_ =
         dVar419 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar158._12_4_ = (int)((ulong)dStack_1990 >> 0x20);
    dVar323 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar419 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1];
    dStack_1990 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * dStack_1990;
    auVar285._8_4_ = SUB84(dStack_1990,0);
    auVar285._0_8_ = dVar323;
    auVar285._12_4_ = (int)((ulong)dStack_1990 >> 0x20);
    uVar395 = SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0],0);
    uVar397 = (undefined4)
              ((ulong)v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] >> 0x20);
    auVar159._8_4_ = uVar395;
    auVar159._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar159._12_4_ = uVar397;
    dVar323 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar323;
    dStack_1990 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * dStack_1990;
    auVar160._8_4_ = SUB84(dStack_1990,0);
    auVar160._0_8_ = dVar323;
    auVar160._12_4_ = (int)((ulong)dStack_1990 >> 0x20);
    dVar246 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar123;
    auVar161._8_4_ =
         SUB84(dStack_1990 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5],0);
    auVar161._0_8_ = dVar246;
    auVar161._12_4_ =
         (int)((ulong)(dStack_1990 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5]) >> 0x20);
    dVar247 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar543;
    dVar277 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * auVar1._8_8_;
    auVar162._8_4_ = SUB84(dVar277,0);
    auVar162._0_8_ = dVar247;
    auVar162._12_4_ = (int)((ulong)dVar277 >> 0x20);
    dVar277 = dVar543 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar367 = dVar134 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar543 = -dVar504 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar364._8_4_ = SUB84(dVar543,0);
    auVar364._0_8_ = dVar367;
    auVar364._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dVar367 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar367;
    dVar543 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar543;
    auVar163._8_4_ = SUB84(dVar543,0);
    auVar163._0_8_ = dVar367;
    auVar163._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dVar248 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -dVar277;
    auVar164._8_4_ =
         SUB84(dVar543 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[5],0);
    auVar164._0_8_ = dVar248;
    auVar164._12_4_ =
         (int)((ulong)(dVar543 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5]) >> 0x20);
    local_15f8 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] *
                 dVar526 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[5];
    dVar527 = -(dVar526 *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5]);
    auVar20._8_4_ = uVar395;
    auVar20._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar20._12_4_ = uVar397;
    dVar124 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] * dVar504;
    dVar543 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * auVar19._8_8_;
    auVar21._8_4_ = SUB84(dVar543,0);
    auVar21._0_8_ = dVar124;
    auVar21._12_4_ = (int)((ulong)dVar543 >> 0x20);
    auVar351._8_4_ = uVar384;
    auVar351._0_8_ = dVar527;
    auVar351._12_4_ = uVar391;
    dVar454 = -dVar464 *
              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    auVar165._8_4_ =
         SUB84(u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] * dVar479,0);
    auVar165._0_8_ = dVar454;
    auVar165._12_4_ =
         (int)((ulong)(u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] * dVar479) >> 0x20);
    dVar583 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    local_1cb8 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2] *
                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4];
    dVar324 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar441;
    dVar543 = dVar517 * dVar562 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[1];
    auVar286._8_4_ = SUB84(dVar543,0);
    auVar286._0_8_ = dVar324;
    auVar286._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dVar442 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar357 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    uStack_1c40._0_4_ = SUB84(local_1c48,0);
    uStack_1c40._4_4_ = (undefined4)((ulong)local_1c48 >> 0x20);
    uStack_1480 = (undefined4)uStack_1c40;
    uStack_147c = uStack_1c40._4_4_;
    local_1e78._0_4_ = SUB84(local_19b8,0);
    local_1e78._4_4_ = (undefined4)((ulong)local_19b8 >> 0x20);
    uStack_1c40._0_4_ = (undefined4)local_1e78;
    uStack_1c40._4_4_ = local_1e78._4_4_;
    dVar543 = -dVar438;
    dVar249 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar543;
    dVar529 = local_1cb8 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar421 = dVar562 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar365._8_4_ = SUB84(dVar421,0);
    auVar365._0_8_ = dVar529;
    auVar365._12_4_ = (int)((ulong)dVar421 >> 0x20);
    auVar287._8_4_ = (undefined4)uStack_19b0;
    auVar287._0_8_ =
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar287._12_4_ = uStack_19b0._4_4_;
    uStack_1e70._0_4_ = (undefined4)uStack_19b0;
    local_1e78 = dVar488;
    uStack_1e70._4_4_ = uStack_19b0._4_4_;
    dVar466 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar480 = dVar504 * dVar517 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    auVar456._8_4_ = SUB84(dVar335,0);
    auVar456._0_8_ = dVar419;
    auVar456._12_4_ = uVar399;
    dVar459 = auVar456._8_8_ *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar419 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
                    dVar419 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0];
    dVar421 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar459;
    auVar22._8_4_ = SUB84(dVar421,0);
    auVar22._0_8_ = dVar419;
    auVar22._12_4_ = (int)((ulong)dVar421 >> 0x20);
    dVar421 = -(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar244);
    dVar443 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dStack_1b60 *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    uVar390 = (uint)((ulong)dVar443 >> 0x20);
    auVar23._8_4_ = SUB84(dVar443,0);
    auVar23._0_8_ = dVar421;
    auVar23._12_4_ = uVar390;
    dVar467 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar442 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar481 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar459 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_18c0 = auVar165._8_8_;
    dVar454 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar454 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar504 = dVar517 * dStack_18c0 *
                        u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    auVar24._8_4_ = SUB84(dVar504,0);
    auVar24._0_8_ = dVar454;
    auVar24._12_4_ = (int)((ulong)dVar504 >> 0x20);
    dVar325 = dStack_18c0 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar326 = -dVar325 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    auVar288._8_4_ = SUB84(dVar443,0);
    auVar288._0_8_ = dVar326;
    auVar288._12_4_ = uVar390 ^ 0x80000000;
    dVar504 = -(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * 4.0);
    dStack_1d10 = auVar363._8_8_;
    dVar455 = dVar504 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar444 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dStack_1ee0 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar460 = dVar553 * dStack_1b80;
    dVar478 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar460 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4];
    dStack_1d00 = auVar2._8_8_;
    dVar445 = dVar129 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    auVar289._8_4_ = SUB84(dVar478,0);
    auVar289._0_8_ = dVar455;
    auVar289._12_4_ = (uint)((ulong)dVar478 >> 0x20) ^ 0x80000000;
    dVar544 = dVar582 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar446 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar461 = dVar517 * dStack_18c0 * dStack_1d10;
    dVar468 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar446;
    dStack_1c50 = auVar20._8_8_;
    dVar446 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar446;
    dVar482 = dStack_1c50 * dVar461;
    dVar462 = -dVar461 * dStack_1ef0;
    dVar250 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar486 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar250 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar358 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar486;
    dVar359 = -dVar358;
    dVar528 = dStack_18c0 * dStack_1b80 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar461 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar528;
    auVar352._8_4_ = SUB84(dVar461,0);
    auVar352._0_8_ = dVar359;
    auVar352._12_4_ = (int)((ulong)dVar461 >> 0x20);
    dVar545 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar135 = dVar521 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    uVar384 = (undefined4)((ulong)dVar553 >> 0x20);
    uStack_1cb0._0_4_ = SUB84(dVar562,0);
    uStack_1cb0._4_4_ = (int)((ulong)dVar562 >> 0x20);
    auVar25._8_4_ = SUB84(dVar135,0);
    auVar25._0_8_ = dVar545;
    auVar25._12_4_ = (int)((ulong)dVar135 >> 0x20);
    auVar26._8_4_ = SUB84(dVar553,0);
    auVar26._0_8_ = dVar545;
    auVar26._12_4_ = uVar384;
    dVar546 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    auVar27._8_4_ = SUB84(dVar553,0);
    auVar27._0_8_ = dVar546;
    auVar27._12_4_ = uVar384;
    dVar342 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar464;
    dVar589 = dVar517 * dVar562 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0];
    dStack_1920 = auVar159._8_8_;
    dVar251 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    dVar342 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0];
    dVar553 = dStack_1920 * dVar589;
    uVar384 = SUB84(dVar553,0);
    uVar398 = (uint)((ulong)dVar553 >> 0x20);
    auVar166._8_4_ = uVar384;
    auVar166._0_8_ = dVar251;
    auVar166._12_4_ = uVar398;
    dStack_13d0 = auVar285._8_8_;
    dVar589 = dVar589 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar167._8_4_ =
         SUB84(-dStack_13d0 *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5],0);
    auVar167._0_8_ = dVar589;
    auVar167._12_4_ =
         (int)((ulong)(-dStack_13d0 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5]) >> 0x20);
    auVar168._8_4_ =
         SUB84(uStack_1c40 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar168._0_8_ =
         local_1c48 *
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar168._12_4_ =
         (int)((ulong)(uStack_1c40 *
                      u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dVar252 = -dVar583 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar553 = -(u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dStack_1ee0) *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    auVar169._8_4_ = SUB84(dVar553,0);
    auVar169._0_8_ = dVar252;
    auVar169._12_4_ = (int)((ulong)dVar553 >> 0x20);
    dVar584 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar342;
    dVar553 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar479 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1];
    auVar337._8_4_ = SUB84(dVar553,0);
    auVar337._0_8_ =
         -dVar342 *
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    auVar337._12_4_ = (int)((ulong)dVar553 >> 0x20);
    dVar553 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar505 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar253 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar254 = dVar405 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar255 = dVar405 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar473 = dVar128 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar497 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar479 * dStack_1d10;
    uStack_1cb0 = uStack_1cb0 * dStack_1d10;
    dStack_1ad0 = auVar17._8_8_;
    auVar170._8_4_ = SUB84(dVar473,0);
    auVar170._0_8_ = dVar403;
    auVar170._12_4_ = (uint)((ulong)dVar473 >> 0x20) ^ 0x80000000;
    dVar560 = dVar488 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1c10 = auVar365._8_8_;
    dVar529 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar529;
    dVar548 = dStack_1920 * dStack_1c10;
    dVar256 = -dStack_1c10;
    auVar171._8_4_ = SUB84(dVar560,0);
    auVar171._0_8_ = dVar256;
    auVar171._12_4_ = (int)((ulong)dVar560 >> 0x20);
    dVar327 = -dVar440 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    auVar290._8_4_ = SUB84(dVar473 * dVar517,0);
    auVar290._0_8_ = dVar327;
    auVar290._12_4_ = (int)((ulong)(dVar473 * dVar517) >> 0x20);
    dVar560 = dVar517 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
                        u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * dVar479;
    auVar172._8_4_ = SUB84(dVar560,0);
    auVar172._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] *
         dVar584;
    auVar172._12_4_ = (int)((ulong)dVar560 >> 0x20);
    dVar560 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1cb8 *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    auVar28._8_4_ =
         SUB84(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] * uStack_1cb0,0);
    auVar28._0_8_ = dVar560;
    auVar28._12_4_ =
         (int)((ulong)(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] * uStack_1cb0) >> 0x20);
    auVar173._8_4_ = SUB84(uStack_1cb0,0);
    auVar173._0_8_ = dVar584;
    auVar173._12_4_ = (int)((ulong)uStack_1cb0 >> 0x20);
    dVar257 = dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dStack_13c0 = auVar151._8_8_;
    dVar241 = dVar241 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar278 = dStack_13c0 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    uVar399 = (undefined4)((ulong)dVar278 >> 0x20);
    auVar174._8_4_ = SUB84(dVar278,0);
    auVar174._0_8_ = dVar241;
    auVar174._12_4_ = uVar399;
    dVar473 = dVar562 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    uVar391 = SUB84(dVar473,0);
    uVar390 = (uint)((ulong)dVar473 >> 0x20);
    auVar175._8_4_ = uVar391;
    auVar175._0_8_ = -dVar278;
    auVar175._12_4_ = uVar390;
    auVar176._8_4_ = uVar391;
    auVar176._0_8_ = dVar257;
    auVar176._12_4_ = uVar390 ^ 0x80000000;
    dStack_1930 = auVar287._8_8_;
    dVar540 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar504;
    dVar504 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dStack_1930 *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    auVar177._8_4_ = SUB84(dVar504,0);
    auVar177._0_8_ = dVar540;
    auVar177._12_4_ = (int)((ulong)dVar504 >> 0x20);
    dVar504 = -(dStack_1930 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0]);
    local_19b8 = local_19b8 *
                 u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
    dVar136 = uStack_19b0 * dStack_1b80;
    auVar29._8_4_ = SUB84(dVar136,0);
    auVar29._0_8_ = local_19b8;
    auVar29._12_4_ = (int)((ulong)dVar136 >> 0x20);
    dVar258 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * local_19b8;
    dVar473 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * dVar136;
    auVar178._8_4_ = SUB84(dVar473,0);
    auVar178._0_8_ = dVar258;
    auVar178._12_4_ = (int)((ulong)dVar473 >> 0x20);
    auVar179._8_4_ =
         SUB84(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3],0);
    auVar179._0_8_ =
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar179._12_4_ =
         (int)((ulong)u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] >> 0x20);
    dVar473 = dVar488 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    uStack_1e70 = uStack_1e70 *
                  u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3];
    dVar586 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar473;
    uVar390 = (uint)((ulong)dVar586 >> 0x20);
    uStack_1400._0_4_ = SUB84(uStack_1e70,0);
    uStack_1400._4_4_ = (uint)((ulong)uStack_1e70 >> 0x20) ^ 0x80000000;
    dVar555 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0];
    auVar30._8_4_ =
         SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar30._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar30._12_4_ = uVar385;
    dVar562 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar586;
    dVar574 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * uStack_1e70;
    auVar31._8_4_ = SUB84(dVar574,0);
    auVar31._0_8_ = dVar562;
    auVar31._12_4_ = (int)((ulong)dVar574 >> 0x20);
    auVar180._8_4_ = SUB84(dVar586,0);
    auVar180._0_8_ = dVar555;
    auVar180._12_4_ = uVar390;
    uStack_1860._0_4_ = SUB84(dVar586,0);
    uStack_1860._4_4_ = uVar390 ^ 0x80000000;
    dVar574 = dStack_1b60 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    auVar32._8_4_ = SUB84(dVar244,0);
    auVar32._0_8_ = dVar574;
    auVar32._12_4_ = (int)((ulong)dVar244 >> 0x20);
    dStack_1b50 = auVar25._8_8_;
    dStack_1710 = auVar162._8_8_;
    dVar586 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar247;
    uVar390 = SUB84(dStack_1ef0 * dStack_1710,0);
    uVar392 = (uint)((ulong)(dStack_1ef0 * dStack_1710) >> 0x20);
    auVar33._8_4_ = uVar390;
    auVar33._0_8_ = dVar586;
    auVar33._12_4_ = uVar392;
    dVar407 = dStack_1b50 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar587 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar407;
    dVar137 = dStack_1920 *
              -dVar505 * dStack_1b80 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar34._8_4_ = SUB84(dVar137,0);
    auVar34._0_8_ = dVar587;
    auVar34._12_4_ = (int)((ulong)dVar137 >> 0x20);
    dVar247 = dVar247 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    dVar119 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar119 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar35._8_4_ = SUB84(dVar119,0);
    auVar35._0_8_ = dVar247;
    auVar35._12_4_ = (int)((ulong)dVar119 >> 0x20);
    dVar119 = dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dStack_14b0 = auVar154._8_8_;
    dVar319 = dVar319 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar291._8_4_ = SUB84(dStack_14b0 * dStack_1c50,0);
    auVar291._0_8_ = dVar319;
    auVar291._12_4_ = (int)((ulong)(dStack_14b0 * dStack_1c50) >> 0x20);
    auVar36._8_4_ = SUB84(dVar319,0);
    auVar36._0_8_ = dVar119;
    auVar36._12_4_ = (uint)((ulong)dVar319 >> 0x20) ^ 0x80000000;
    dStack_1070 = auVar364._8_8_;
    local_1ec8 = -(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                  u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5]) *
                 u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    dVar137 = dVar588 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar582 = -dVar582 *
              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    dVar138 = -dVar588 *
              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5];
    auVar37._8_4_ = SUB84(dVar138,0);
    auVar37._0_8_ = dVar582;
    auVar37._12_4_ = (int)((ulong)dVar138 >> 0x20);
    auVar38._8_4_ =
         SUB84(dVar138 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2],0);
    auVar38._0_8_ =
         dVar582 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar38._12_4_ =
         (int)((ulong)(dVar138 *
                      u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2]) >> 0x20);
    dVar138 = dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    uStack_1ec0._0_4_ =
         SUB84(dStack_1e90 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    uStack_1ec0._4_4_ =
         (undefined4)
         ((ulong)(dStack_1e90 *
                 u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2]) >> 0x20);
    auVar39._8_4_ = (undefined4)uStack_1ec0;
    auVar39._0_8_ = dVar138;
    auVar39._12_4_ = uStack_1ec0._4_4_;
    dVar125 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar129;
    auVar40._8_4_ =
         SUB84(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] * dStack_1d00,0);
    auVar40._0_8_ = dVar125;
    auVar40._12_4_ =
         (int)((ulong)(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * dStack_1d00) >> 0x20);
    dVar279 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] * dVar588;
    auVar181._8_4_ = SUB84(dVar279,0);
    auVar181._0_8_ =
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         dVar442;
    auVar181._12_4_ = (int)((ulong)dVar279 >> 0x20);
    dVar279 = -dVar442 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar496 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar496;
    auVar41._8_4_ = SUB84(dVar496,0);
    auVar41._0_8_ = dVar279;
    auVar41._12_4_ = (int)((ulong)dVar496 >> 0x20);
    dVar440 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar440 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar139 = dVar517 * dStack_1d70 *
                        u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar42._8_4_ = SUB84(dVar139,0);
    auVar42._0_8_ = dVar440;
    auVar42._12_4_ = (int)((ulong)dVar139 >> 0x20);
    dStack_1750 = auVar179._8_8_;
    dVar506 = dVar129 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar469 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar240 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar487 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_1a50 = auVar177._8_8_;
    dVar576 = dStack_1ef0 * dStack_1a50;
    dVar280 = dStack_1d00 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar274;
    dVar139 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dVar506 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar140 = dVar240 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    auVar43._8_4_ = SUB84(dVar140,0);
    auVar43._0_8_ = dVar139;
    auVar43._12_4_ = (int)((ulong)dVar140 >> 0x20);
    dVar530 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] * dVar442 *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar549 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar280;
    dVar140 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar279;
    auVar44._8_4_ = SUB84(dVar517 * dVar496,0);
    auVar44._0_8_ = dVar140;
    auVar44._12_4_ = (int)((ulong)(dVar517 * dVar496) >> 0x20);
    dStack_17c0 = auVar14._8_8_;
    dVar259 = dVar140 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    dVar496 = -dVar280 * dStack_17c0;
    auVar182._8_4_ = SUB84(dVar496,0);
    auVar182._0_8_ = dVar259;
    auVar182._12_4_ = (int)((ulong)dVar496 >> 0x20);
    auVar183._8_4_ =
         SUB84(dVar496 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4],0);
    auVar183._0_8_ =
         dVar259 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    auVar183._12_4_ =
         (int)((ulong)(dVar496 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]) >> 0x20);
    auVar184._8_4_ =
         SUB84(-dVar481 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4],0);
    auVar184._0_8_ =
         dVar443 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    auVar184._12_4_ =
         (int)((ulong)(-dVar481 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]) >> 0x20);
    dVar496 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] * dVar540;
    dVar540 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar576;
    auVar45._8_4_ = SUB84(dVar540,0);
    auVar45._0_8_ = dVar496;
    auVar45._12_4_ = (int)((ulong)dVar540 >> 0x20);
    dVar531 = -(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] *
               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4]) *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    auVar46._8_4_ = uVar395;
    auVar46._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    auVar46._12_4_ = uVar397;
    dVar592 = dVar504 * dVar517 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1880 = auVar18._8_8_;
    dStack_1880 = dStack_1880 * auVar39._8_8_;
    auVar185._8_4_ = SUB84(dStack_1880,0);
    auVar185._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         dVar138;
    auVar185._12_4_ = (int)((ulong)dStack_1880 >> 0x20);
    dVar532 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0];
    dVar585 = dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar590 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar138;
    dVar540 = dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar260 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar540;
    dVar280 = -dVar260;
    dVar565 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar585;
    auVar47._8_4_ = SUB84(dVar565,0);
    auVar47._0_8_ = dVar280;
    auVar47._12_4_ = (uint)((ulong)dVar565 >> 0x20) ^ 0x80000000;
    dVar126 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar342 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar48._8_4_ = SUB84(dVar587,0);
    auVar48._0_8_ = dVar126;
    auVar48._12_4_ = (uint)((ulong)dVar587 >> 0x20) ^ 0x80000000;
    dStack_1d40 = auVar26._8_8_;
    auVar49._8_4_ =
         SUB84(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] * dStack_1d40,0);
    auVar49._0_8_ =
         u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         dVar545;
    auVar49._12_4_ =
         (int)((ulong)(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * dStack_1d40) >> 0x20);
    dStack_1e00 = auVar27._8_8_;
    auVar50._8_4_ = SUB84(dStack_1e00 * dStack_1750,0);
    auVar50._0_8_ =
         dVar546 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar50._12_4_ = (int)((ulong)(dStack_1e00 * dStack_1750) >> 0x20);
    dVar127 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * dVar444;
    dVar141 = dStack_1ef0 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar460;
    auVar51._8_4_ = SUB84(dVar141,0);
    auVar51._0_8_ = dVar127;
    auVar51._12_4_ = (int)((ulong)dVar141 >> 0x20);
    auVar186._8_4_ = SUB84(dVar444,0);
    auVar186._0_8_ = dVar406;
    auVar186._12_4_ = (int)((ulong)dVar444 >> 0x20);
    auVar292._8_4_ =
         SUB84(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3],0);
    auVar292._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar292._12_4_ =
         (int)((ulong)v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] >> 0x20);
    dVar408 = dVar488 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar141 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar408 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar472 = dVar588 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar343 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar472;
    dVar344 = dVar343 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar345 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar532 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar533 = dVar532 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar261 = dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    auVar187._8_4_ =
         SUB84(dVar544 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4],0);
    auVar187._0_8_ = dVar261;
    auVar187._12_4_ =
         (int)((ulong)(dVar544 *
                      u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]) >> 0x20);
    dVar534 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar261 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar262 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar128 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar263 = dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    auVar188._8_4_ =
         SUB84(dStack_1d00 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar188._0_8_ = dVar263;
    auVar188._12_4_ =
         (int)((ulong)(dStack_1d00 *
                      u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dVar447 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar263 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar264 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * -(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4] *
                     u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[0]) *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar128 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar497;
    auVar189._8_4_ = SUB84(dVar128,0);
    auVar189._0_8_ = dVar264;
    auVar189._12_4_ = (int)((ulong)dVar128 >> 0x20);
    dVar470 = dVar497 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar471 = dVar470 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar128 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar325 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar265 = -dVar137 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar137 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar137 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    uVar550 = SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1],0);
    uVar551 = (undefined4)
              ((ulong)v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] >> 0x20);
    auVar190._8_4_ = uVar550;
    auVar190._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar190._12_4_ = uVar551;
    dVar325 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar321 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar321 = dVar321 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar444 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar228 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4];
    dVar507 = -(dVar228 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0]) *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar497 = dVar228 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar508 = -dVar497 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3];
    dVar497 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar497 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    local_1ec8 = local_1ec8 *
                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
    auVar52._8_4_ =
         SUB84(uStack_1ec0 *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0],0);
    auVar52._0_8_ = local_1ec8;
    auVar52._12_4_ =
         (int)((ulong)(uStack_1ec0 *
                      v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0]) >> 0x20);
    dStack_1bb0 = auVar169._8_8_;
    dVar532 = dVar252 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar53._8_4_ =
         SUB84(dStack_1bb0 *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0],0);
    auVar53._0_8_ = dVar532;
    auVar53._12_4_ =
         (int)((ulong)(dStack_1bb0 *
                      v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0]) >> 0x20);
    dStack_1ba0 = auVar153._8_8_;
    dVar488 = dVar488 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1800 = auVar150._8_8_;
    dVar509 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar239;
    dVar535 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar509 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar489 = dVar239 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar346 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar239 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar566 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar509 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar347 = dVar346 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar368 = dVar228 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_1c20 = auVar283._8_8_;
    dVar536 = dStack_1c20 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar348 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar553 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar349 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar276 * dStack_1ef0;
    dStack_1220 = auVar158._8_8_;
    dVar266 = -dVar553 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_1900 = auVar180._8_8_;
    dVar555 = dVar555 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar567 = dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar486 = dVar486 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar553 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dStack_18c0 * dStack_1b80 * dStack_1920;
    auVar293._8_4_ = SUB84(dVar553,0);
    auVar293._0_8_ = dVar486;
    auVar293._12_4_ = (int)((ulong)dVar553 >> 0x20);
    dStack_1b10 = auVar28._8_8_;
    dVar560 = dVar560 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar294._8_4_ = SUB84(dStack_1b10 * dStack_1920,0);
    auVar294._0_8_ = dVar560;
    auVar294._12_4_ = (int)((ulong)(dStack_1b10 * dStack_1920) >> 0x20);
    dStack_1c10 = auVar171._8_8_;
    dVar256 = dVar256 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar295._8_4_ = SUB84(dStack_1c10 * dStack_1920,0);
    auVar295._0_8_ = dVar256;
    auVar295._12_4_ = (int)((ulong)(dStack_1c10 * dStack_1920) >> 0x20);
    uStack_1cb0 = auVar173._8_8_;
    dVar328 = -dVar584 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar553 = -uStack_1cb0 * dVar517 * dStack_1920;
    auVar296._8_4_ = SUB84(dVar553,0);
    auVar296._0_8_ = dVar328;
    auVar296._12_4_ = (int)((ulong)dVar553 >> 0x20);
    auVar54._8_4_ = uVar383;
    auVar54._0_8_ =
         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    auVar54._12_4_ = uVar389;
    dVar329 = local_1408 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar553 = uStack_1400 * dVar517 * dStack_1920;
    auVar297._8_4_ = SUB84(dVar553,0);
    auVar297._0_8_ = dVar329;
    auVar297._12_4_ = (int)((ulong)dVar553 >> 0x20);
    dVar408 = dVar408 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar553 = dVar460 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] * dStack_1920;
    uVar383 = SUB84(dVar553,0);
    uVar393 = (uint)((ulong)dVar553 >> 0x20);
    auVar55._8_4_ = uVar383;
    auVar55._0_8_ = dVar408;
    auVar55._12_4_ = uVar393;
    dVar267 = dVar324 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar553 = -(dVar420 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0]) *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dStack_1920;
    auVar191._8_4_ = SUB84(dVar553,0);
    auVar191._0_8_ = dVar267;
    auVar191._12_4_ = (int)((ulong)dVar553 >> 0x20);
    dVar369 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * -(dVar583 *
                     u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[0]) *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_1920 = dStack_1920 *
                  dStack_1220 *
                  v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4];
    auVar366._8_4_ = SUB84(dStack_1920,0);
    auVar366._0_8_ = dVar369;
    auVar366._12_4_ = (int)((ulong)dStack_1920 >> 0x20);
    dVar553 = dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar239 = dVar473 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    auVar56._8_4_ = SUB84(dVar239,0);
    auVar56._0_8_ = dVar553;
    auVar56._12_4_ = (int)((ulong)dVar239 >> 0x20);
    dVar553 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar553;
    dVar228 = dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_16a0 = auVar30._8_8_;
    dVar490 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar583 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar498 = -(dStack_1220 *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4]) * dStack_16a0;
    dVar510 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar252 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar330 = -dVar422 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar231 = dVar231 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dStack_16a0;
    auVar298._8_4_ = SUB84(dVar231,0);
    auVar298._0_8_ = dVar330;
    auVar298._12_4_ = (int)((ulong)dVar231 >> 0x20);
    dStack_1af0 = auVar351._8_8_;
    dVar527 = dVar527 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar299._8_4_ = SUB84(dStack_1af0 * dStack_16a0,0);
    auVar299._0_8_ = dVar527;
    auVar299._12_4_ = (int)((ulong)(dStack_1af0 * dStack_16a0) >> 0x20);
    dStack_14e0 = auVar24._8_8_;
    dVar454 = dVar454 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    uVar395 = SUB84(dStack_14e0 * dStack_16a0,0);
    uVar433 = (uint)((ulong)(dStack_14e0 * dStack_16a0) >> 0x20);
    auVar300._8_4_ = uVar395;
    auVar300._0_8_ = dVar454;
    auVar300._12_4_ = uVar433;
    dVar331 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * -dVar583 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dVar231 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * -(dVar588 *
                     u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[3]) * dVar274 * dStack_16a0;
    auVar301._8_4_ = SUB84(dVar231,0);
    auVar301._0_8_ = dVar331;
    auVar301._12_4_ = (int)((ulong)dVar231 >> 0x20);
    dVar231 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar583 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2];
    dVar268 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar231;
    dVar332 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar488;
    dStack_16a0 = dStack_16a0 *
                  dStack_1ba0 *
                  v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0];
    uVar397 = SUB84(dStack_16a0,0);
    uVar434 = (undefined4)((ulong)dStack_16a0 >> 0x20);
    auVar302._8_4_ = uVar397;
    auVar302._0_8_ = dVar332;
    auVar302._12_4_ = uVar434;
    dStack_1450 = auVar46._8_8_;
    dVar231 = dVar231 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar488 = dVar488 * dStack_1450;
    auVar57._8_4_ = SUB84(dVar488,0);
    auVar57._0_8_ = dVar231;
    auVar57._12_4_ = (int)((ulong)dVar488 >> 0x20);
    uVar431 = SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0],0);
    uVar435 = (undefined4)
              ((ulong)v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] >> 0x20);
    dVar424 = dStack_1c20 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar303._8_4_ = uVar431;
    auVar303._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar303._12_4_ = uVar435;
    dVar556 = dVar276 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    uVar385 = SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2],0);
    uVar391 = (undefined4)
              ((ulong)v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] >> 0x20);
    auVar192._8_4_ = uVar385;
    auVar192._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar192._12_4_ = uVar391;
    dVar269 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar543 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar252 = dVar240 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar193._8_4_ = SUB84(dVar252,0);
    auVar193._0_8_ = dVar269;
    auVar193._12_4_ = (int)((ulong)dVar252 >> 0x20);
    dVar488 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar473 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_17d0 = auVar366._8_8_;
    auVar194._8_4_ = uVar550;
    auVar194._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar194._12_4_ = uVar551;
    dStack_17e0 = auVar57._8_8_;
    dStack_1e30 = auVar190._8_8_;
    dStack_1db0 = auVar49._8_8_;
    dStack_1e00 = auVar50._8_8_;
    dStack_1c80 = auVar40._8_8_;
    dVar409 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar506 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar425 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * -dVar130 * dStack_1750 * dStack_17c0;
    dVar448 = dVar125 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dStack_17c0 = dStack_1c80 *
                  v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * dStack_17c0;
    dStack_1910 = auVar13._8_8_;
    dVar240 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar449 = dStack_1910 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar270 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar483;
    dStack_1a50 = dStack_1a50 *
                  v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5];
    uStack_19b0 = auVar29._8_8_;
    dVar450 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar526;
    dVar410 = -(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar526) *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5];
    dVar499 = dVar504 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * dStack_1c50;
    dStack_1650 = auVar284._8_8_;
    dStack_1d60 = auVar187._8_8_;
    auVar195._8_4_ = SUB84(dStack_1d60 * dStack_1650,0);
    auVar195._0_8_ =
         dVar261 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar195._12_4_ = (int)((ulong)(dStack_1d60 * dStack_1650) >> 0x20);
    dStack_1b00 = auVar157._8_8_;
    dVar243 = dVar243 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar196._8_4_ = SUB84(dStack_1b00 * dStack_1650,0);
    auVar196._0_8_ = dVar243;
    auVar196._12_4_ = (int)((ulong)(dStack_1b00 * dStack_1650) >> 0x20);
    dStack_1b70 = auVar186._8_8_;
    auVar197._8_4_ = SUB84(dStack_1b70 * dStack_1650,0);
    auVar197._0_8_ =
         dVar406 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar197._12_4_ = (int)((ulong)(dStack_1b70 * dStack_1650) >> 0x20);
    dStack_1e50 = auVar170._8_8_;
    auVar198._8_4_ = SUB84(dStack_1e50 * dStack_1650,0);
    auVar198._0_8_ =
         dVar403 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar198._12_4_ = (int)((ulong)(dStack_1e50 * dStack_1650) >> 0x20);
    dVar500 = -uStack_19b0 * dStack_1650;
    dVar504 = auVar37._8_8_ * dStack_1b80;
    auVar338._8_4_ = SUB84(dVar504,0);
    auVar338._0_8_ =
         dVar582 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
    auVar338._12_4_ = (int)((ulong)dVar504 >> 0x20);
    dVar271 = dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar504 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar441 * dStack_1450;
    auVar199._8_4_ = SUB84(dVar504,0);
    auVar199._0_8_ = dVar271;
    auVar199._12_4_ = (int)((ulong)dVar504 >> 0x20);
    dStack_1a10 = auVar4._8_8_;
    dVar275 = dVar275 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    auVar200._8_4_ = SUB84(dStack_1a10 * dStack_1450,0);
    auVar200._0_8_ = dVar275;
    auVar200._12_4_ = (int)((ulong)(dStack_1a10 * dStack_1450) >> 0x20);
    dVar272 = -dVar234 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar504 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar460 * dStack_1450;
    auVar201._8_4_ = SUB84(dVar504,0);
    auVar201._0_8_ = dVar272;
    auVar201._12_4_ = (int)((ulong)dVar504 >> 0x20);
    dVar407 = dVar407 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    uVar389 = SUB84(dStack_1710 * dStack_1450,0);
    uVar400 = (uint)((ulong)(dStack_1710 * dStack_1450) >> 0x20);
    auVar202._8_4_ = uVar389;
    auVar202._0_8_ = dVar407;
    auVar202._12_4_ = uVar400;
    dVar411 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1450 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * dVar588 * dStack_1b80 * dVar274 * dStack_1450;
    dVar412 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar413 = dVar485 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_1d10 = auVar41._8_8_;
    dVar588 = dStack_1d10 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dStack_1a30 = auVar301._8_8_;
    dVar360 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1f20 = auVar181._8_8_;
    dVar491 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar442 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar273 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar491;
    dVar422 = dStack_1c50 * dStack_1f20 * dVar274;
    dStack_1e90 = auVar188._8_8_;
    dStack_1ca0 = auVar155._8_8_;
    dVar537 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] * dVar263;
    dVar370 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar263 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar371 = dVar274 * dStack_1e90 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_16c0 = auVar292._8_8_;
    uStack_1c40 = auVar168._8_8_;
    dStack_1710 = auVar38._8_8_;
    dVar463 = dStack_1710 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar414 = local_1c48 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar426 = uStack_1c40 * dVar517 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar415 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dVar403 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar427 = dStack_1ad0 *
              dVar335 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar557 = dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar563 = -dStack_1e90 * dStack_16c0 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar451 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar511 = -(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] *
               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3]) *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar472 = dVar472 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dStack_1c70 = auVar194._8_8_;
    dStack_1c20 = auVar192._8_8_;
    auVar203._8_4_ = SUB84(dVar422,0);
    auVar203._0_8_ = dVar273;
    auVar203._12_4_ = (int)((ulong)dVar422 >> 0x20);
    dVar473 = dStack_1f20 * dVar274 * dStack_1ef0;
    auVar58._8_4_ = SUB84(dVar473,0);
    auVar58._0_8_ =
         dVar491 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
    auVar58._12_4_ = (int)((ulong)dVar473 >> 0x20);
    dStack_1ba0 = auVar303._8_8_;
    dVar504 = -(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar491) *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] + dVar273 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] +
                    dVar411 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] +
                    dVar360 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    dVar331 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] +
                    dVar268 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] +
                    ((dVar510 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                     dVar490 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                     dVar369 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3] +
                     -dVar228 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[0] +
                     dVar553 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] +
                     dVar567 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                     ((dVar266 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                      dVar348 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1] +
                      dVar322 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                      -dVar484 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2]) -
                     dVar555 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3])) -
                    dVar231 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1]);
    dVar473 = dVar473 * dStack_1ba0 +
              dVar422 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
              dStack_1450 * dStack_1c20 +
              -dVar472 * dStack_1c70 +
              dStack_1a30 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] + -dVar332 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] +
                    ((dVar408 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1] +
                     dVar498 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] +
                     dStack_17d0 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[1] +
                     dVar488 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                     dStack_1ef0 * dVar239 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] +
                     -dVar562 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[3] +
                     ((-dVar556 *
                       v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
                      dVar349 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[4] +
                      dVar424 + ((((((((((((((dVar115 -
                                             dVar404 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0]) - dVar525) + dVar120)
                                          - dVar141) + dVar344 + dVar345) - dVar533) + dVar534) -
                                      dVar262) - dVar471) + dVar128 + dVar265 + dVar137) - dVar325)
                                   + dVar321 + dVar444 + dVar507 + dVar508 + dVar497 + dVar566 +
                                  dVar535) - dVar347) - dVar489) + dVar368) -
                     dStack_1900 * dStack_1c50 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[4])) - dStack_17e0 * dStack_1e30);
    auVar59._8_4_ = SUB84(dVar473,0);
    auVar59._0_8_ = dVar504;
    auVar59._12_4_ = (int)((ulong)dVar473 >> 0x20);
    dVar473 = dVar129 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar538 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar473;
    dVar474 = -dVar473 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar452 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * dVar125;
    dVar558 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] * dVar129 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar564 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar554 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar591 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar249 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar492 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar235 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar475 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] * dVar235;
    dVar493 = dVar234 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dStack_1ee0 = auVar55._8_8_;
    auVar60._8_4_ = uVar383;
    auVar60._0_8_ = dVar493;
    auVar60._12_4_ = uVar393 ^ 0x80000000;
    dVar473 = dVar234 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar568 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar546 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar577 = dStack_1c50 *
              dStack_1e00 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar546 = -dVar546 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar234 = dVar405 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar263 = dStack_1e00 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dStack_1ef0;
    uVar383 = SUB84(dVar263,0);
    uVar393 = (uint)((ulong)dVar263 >> 0x20);
    auVar353._8_4_ = uVar383;
    auVar353._0_8_ = dVar234;
    auVar353._12_4_ = uVar393;
    auVar354._8_4_ = uVar383;
    auVar354._0_8_ = dVar546;
    auVar354._12_4_ = uVar393 ^ 0x80000000;
    dVar569 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar545 *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar578 = dStack_1c50 *
              dStack_1db0 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar570 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar545 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar579 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar135 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dStack_1ef0;
    dVar545 = dVar505 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dStack_15c0 = auVar34._8_8_;
    dVar494 = dVar505 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar571 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar494;
    dVar494 = dVar494 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dStack_1b50 = auVar202._8_8_;
    auVar61._8_4_ = uVar389;
    auVar61._0_8_ = dVar494;
    auVar61._12_4_ = uVar400 ^ 0x80000000;
    dStack_12f0 = auVar183._8_8_;
    dStack_1f20 = auVar59._8_8_;
    dStack_1f20 = dStack_12f0 + dStack_1f20;
    dStack_19a0 = auVar15._8_8_;
    dVar361 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * dVar232 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1360 = auVar145._8_8_;
    auVar62._8_4_ = uVar394;
    auVar62._0_8_ = -dVar233;
    auVar62._12_4_ = uVar396 ^ 0x80000000;
    auVar304._8_4_ = uVar431;
    auVar304._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar304._12_4_ = uVar435;
    dStack_16c0 = auVar203._8_8_;
    dStack_1d00 = auVar182._8_8_;
    dStack_1410 = auVar286._8_8_;
    uVar394 = SUB84(dStack_1ef0 * dStack_1410,0);
    uVar400 = (uint)((ulong)(dStack_1ef0 * dStack_1410) >> 0x20);
    auVar305._8_4_ = uVar394;
    auVar305._0_8_ =
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         dVar324;
    auVar305._12_4_ = uVar400;
    dStack_1560 = auVar12._8_8_;
    dVar424 = -dVar238 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    uVar432 = SUB84(dStack_1560 * dStack_1ef0,0);
    uVar436 = (undefined4)((ulong)(dStack_1560 * dStack_1ef0) >> 0x20);
    auVar306._8_4_ = uVar432;
    auVar306._0_8_ = dVar424;
    auVar306._12_4_ = uVar436;
    dStack_1e50 = auVar198._8_8_;
    dVar333 = dVar403 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar307._8_4_ = SUB84(dStack_1e50 * dStack_1ef0,0);
    auVar307._0_8_ = dVar333;
    auVar307._12_4_ = (int)((ulong)(dStack_1e50 * dStack_1ef0) >> 0x20);
    dVar512 = dVar324 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar580 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar138 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dVar334 = -(dVar554 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0]) *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3];
    dStack_1ce0 = auVar193._8_8_;
    dVar263 = dStack_1ce0 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1680 = auVar191._8_8_;
    dStack_1170 = auVar146._8_8_;
    auVar63._8_4_ =
         SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3],0);
    auVar63._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    auVar63._12_4_ = uVar594;
    auVar64._8_4_ = uVar385;
    auVar64._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    auVar64._12_4_ = uVar391;
    dStack_11a0 = auVar8._8_8_;
    dStack_1190 = auVar148._8_8_;
    dStack_1cd0 = auVar199._8_8_;
    dVar505 = dStack_1cd0 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1d80 = auVar56._8_8_;
    auVar308._8_4_ = uVar385;
    auVar308._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    auVar308._12_4_ = uVar391;
    dVar114 = dStack_1d80 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
              dVar117 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] +
              dStack_1680 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] + -(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] * dVar276) * dStack_1ef0 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
                    dVar349 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] +
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
                    dVar420 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] * dVar274 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] +
                    -dVar346 * dStack_1ba0 +
                    dVar255 * dVar274 *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[3] * dStack_1ba0 +
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] * dVar254 *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] +
                    -dVar114 * dStack_1e30 +
                    dStack_1170 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] +
                    -dVar254 *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar115 = -dStack_1cd0 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] + dStack_11a0 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
                    dVar267 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] +
                    dVar512 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] +
                    -dVar252 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] +
                    dVar469 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] +
                    dVar564 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    dVar334 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    dStack_17c0 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] +
                    dVar425 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] +
                    dVar233 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] +
                    dVar361 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] +
                    (((dVar563 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                      dVar371 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[3] +
                      dVar549 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                      dStack_1d00 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4] +
                      (((dStack_1450 *
                         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] +
                        dVar472 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[1] +
                        dStack_1a30 *
                        v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
                        dVar332 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] +
                        dStack_17e0 *
                        v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] +
                        ((dVar498 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[0] +
                         dStack_17d0 *
                         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1] +
                         (((dVar562 * v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[3] +
                           dStack_1900 * dStack_1c50 *
                           v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[4] +
                           dVar556 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[2] +
                           ((dVar536 +
                            (((((((dVar471 +
                                  (((((dVar141 +
                                      ((dVar525 +
                                       (dVar404 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] - dVar115)) - dVar120))
                                     - dVar344) - dVar345) + dVar533) - dVar534) + dVar262) -
                                 dVar128) + dVar265 + dVar137 + dVar325) - dVar321) + dVar444 +
                               dVar507 + dVar508 + dVar497) - dVar566) - dVar535) + dVar347 +
                            dVar489 + dVar368) -
                           dVar349 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[4])) -
                          dStack_1ef0 * dVar239 *
                          v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2]) -
                         dVar488 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2])) -
                        dVar408 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[1])) -
                       dStack_16c0 *
                       v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1]) -
                      auVar58._8_8_ *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0])) -
                     dVar270 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[1]) -
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] * dVar483 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0]);
    auVar65._8_4_ = SUB84(dVar115,0);
    auVar65._0_8_ = dVar114;
    auVar65._12_4_ = (int)((ulong)dVar115 >> 0x20);
    dStack_1d40 = auVar201._8_8_;
    dVar262 = dStack_1d40 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dStack_1630 = auVar60._8_8_;
    dStack_1a10 = auVar200._8_8_;
    dVar471 = dStack_1a10 * dStack_1e30;
    dStack_1e20 = auVar304._8_8_;
    dStack_1650 = auVar354._8_8_;
    dVar489 = dStack_1650 * dStack_1e20;
    dStack_1cd0 = auVar65._8_8_;
    dStack_1e00 = auVar353._8_8_;
    dVar539 = -dVar578;
    dStack_18f0 = auVar48._8_8_;
    dVar114 = dVar126 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
              ((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar229 *
                v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] +
               dVar270 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] +
               dVar234 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] +
               -dVar405 *
               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] +
               -dVar343 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] +
               -dVar420 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4] *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] +
               dVar408 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] +
               dVar420 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[3] *
               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] + dVar114) -
              dVar512 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3]);
    dVar115 = dStack_18f0 * dStack_1ba0 +
              ((dVar579 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2] +
               dVar539 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] +
               dStack_1e00 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[0] +
               dVar577 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1] +
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] * dVar503 * dStack_1e20 +
               dStack_1a10 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1] +
               dStack_1ee0 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] +
               -dStack_1d40 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3] + dStack_1cd0) -
              dVar407 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1]);
    auVar66._8_4_ = SUB84(dVar115,0);
    auVar66._0_8_ = dVar114;
    auVar66._12_4_ = (int)((ulong)dVar115 >> 0x20);
    dVar540 = dVar540 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    dStack_1bb0 = auVar53._8_8_;
    dVar115 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dVar532;
    auVar67._8_4_ =
         SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2] * dStack_1bb0,0);
    auVar67._0_8_ = dVar115;
    auVar67._12_4_ =
         (int)((ulong)(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] * dStack_1bb0) >> 0x20);
    dVar274 = dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar420 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar138 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar532 = dVar532 * dStack_1ef0;
    auVar68._8_4_ = SUB84(dVar532,0);
    auVar68._0_8_ = dVar420;
    auVar68._12_4_ = (int)((ulong)dVar532 >> 0x20);
    dVar117 = -dVar583 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar536 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar554 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar442 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar556 = dVar442 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar276 = -(u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * dVar521) *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1950 = auVar61._8_8_;
    auVar204._8_4_ =
         SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[4],0);
    auVar204._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    auVar204._12_4_ =
         (int)((ulong)v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4] >> 0x20);
    dStack_12a0 = auVar47._8_8_;
    dStack_1780 = auVar308._8_8_;
    dVar472 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] *
                    u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    auVar205._8_4_ =
         SUB84(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5] * dVar516,0);
    auVar205._0_8_ = dVar472;
    auVar205._12_4_ =
         (int)((ulong)(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[5] * dVar516) >> 0x20);
    dStack_1b30 = auVar338._8_8_;
    dVar566 = dVar320 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar343 = dVar465 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar120 = -uStack_19b0 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dStack_1ef0;
    auVar206._8_4_ = SUB84(dVar120,0);
    auVar206._0_8_ = dVar343;
    auVar206._12_4_ = (int)((ulong)dVar120 >> 0x20);
    dStack_13f0 = auVar290._8_8_;
    dVar327 = dVar327 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar207._8_4_ = SUB84(dStack_13f0 * dStack_1ef0,0);
    auVar207._0_8_ = dVar327;
    auVar207._12_4_ = (int)((ulong)(dStack_13f0 * dStack_1ef0) >> 0x20);
    dVar344 = -(dVar479 *
               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1]) *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar120 = dVar342 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dStack_1ef0;
    auVar208._8_4_ = SUB84(dVar120,0);
    auVar208._0_8_ = dVar344;
    auVar208._12_4_ = (int)((ulong)dVar120 >> 0x20);
    dStack_1b40 = auVar32._8_8_;
    dVar574 = dVar574 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar209._8_4_ = SUB84(dStack_1b40 * dStack_1ef0,0);
    auVar209._0_8_ = dVar574;
    auVar209._12_4_ = (int)((ulong)(dStack_1b40 * dStack_1ef0) >> 0x20);
    dVar428 = dStack_1db0 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dStack_1ef0;
    dVar345 = dVar506 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar500 = dVar500 * dStack_1ef0;
    auVar210._8_4_ = SUB84(dVar500,0);
    auVar210._0_8_ = dVar345;
    auVar210._12_4_ = (int)((ulong)dVar500 >> 0x20);
    dVar593 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar516;
    dStack_1670 = auVar54._8_8_;
    dVar265 = dVar459 * dStack_1670;
    dVar513 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] *
                    u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar519 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * -dVar516 * dVar517;
    dVar120 = dVar517 * dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4];
    auVar211._8_4_ = SUB84(dVar120,0);
    auVar211._0_8_ =
         dVar279 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
    auVar211._12_4_ = (int)((ulong)dVar120 >> 0x20);
    dStack_1370 = auVar144._8_8_;
    dVar500 = -dStack_1370;
    dVar514 = -(dVar518 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1]) *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar520 = -dVar516 * dVar517 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    uVar383 = SUB84(dVar265 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3],0);
    uVar393 = (uint)((ulong)(dVar265 *
                            v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[3]) >> 0x20);
    auVar212._8_4_ = uVar383;
    auVar212._0_8_ =
         dVar500 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    auVar212._12_4_ = uVar393;
    dVar437 = dVar437 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar346 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar240 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4];
    uVar389 = SUB84(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] * dVar265,0);
    uVar396 = (uint)((ulong)(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] * dVar265) >> 0x20);
    auVar213._8_4_ = uVar389;
    auVar213._0_8_ = dVar346;
    auVar213._12_4_ = uVar396;
    auVar214._8_4_ = uVar389;
    auVar214._0_8_ = dVar437;
    auVar214._12_4_ = uVar396 ^ 0x80000000;
    dStack_1880 = auVar185._8_8_;
    dVar120 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dVar138 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1880 = dStack_1880 *
                  v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    auVar69._8_4_ = SUB84(dStack_1880,0);
    auVar69._0_8_ = dVar120;
    auVar69._12_4_ = (int)((ulong)dStack_1880 >> 0x20);
    uStack_15f0._0_4_ = SUB84(dStack_1880,0);
    uStack_15f0._4_4_ = (int)((ulong)-dStack_1880 >> 0x20);
    dVar137 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -dVar320 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar138 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * -dVar335 * dVar517;
    auVar70._8_4_ = SUB84(dVar138,0);
    auVar70._0_8_ = dVar137;
    auVar70._12_4_ = (int)((ulong)dVar138 >> 0x20);
    auVar71._8_4_ = uVar550;
    auVar71._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar71._12_4_ = uVar551;
    uStack_1740._0_4_ =
         SUB84(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5],0);
    local_1748 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
    uStack_1740._4_4_ =
         (int)((ulong)v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5] >> 0x20);
    auVar72._8_4_ = uVar385;
    auVar72._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar72._12_4_ = uVar391;
    auVar73._8_4_ = uVar431;
    auVar73._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar73._12_4_ = uVar435;
    dVar416 = dVar583 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar320 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar544 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar215._8_4_ = SUB84(dVar420,0);
    auVar215._0_8_ = dVar320;
    auVar215._12_4_ = (int)((ulong)-dVar420 >> 0x20);
    dVar541 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1d60 = auVar195._8_8_;
    dVar138 = dVar261 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar74._8_4_ =
         SUB84(dStack_1d60 *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar74._0_8_ = dVar138;
    auVar74._12_4_ =
         (int)((ulong)(dStack_1d60 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2]) >> 0x20);
    dVar126 = dVar438 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar572 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar126;
    dVar126 = -dVar126 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar479 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar416;
    dStack_1b70 = auVar197._8_8_;
    dVar429 = dStack_1b70 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    uStack_1400 = auVar297._8_8_;
    dVar141 = dVar554 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    dVar128 = -dVar138 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    auVar75._8_4_ = SUB84(dVar128,0);
    auVar75._0_8_ = dVar141;
    auVar75._12_4_ = (int)((ulong)dVar128 >> 0x20);
    dVar335 = dVar126 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    auVar216._8_4_ =
         SUB84(uStack_1400 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar216._0_8_ = dVar335;
    auVar216._12_4_ =
         (int)((ulong)(uStack_1400 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dStack_1e50 = auVar307._8_8_;
    auVar76._8_4_ =
         SUB84(dStack_1e50 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar76._0_8_ =
         dVar333 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
    auVar76._12_4_ =
         (int)((ulong)(dStack_1e50 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dStack_18e0 = auVar31._8_8_;
    auVar77._8_4_ =
         SUB84(dStack_18e0 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar77._0_8_ =
         dVar562 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
    auVar77._12_4_ =
         (int)((ulong)(dStack_18e0 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dStack_1b10 = auVar294._8_8_;
    dVar521 = -dStack_1d40 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    auVar339._8_4_ =
         SUB84(dStack_1b10 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar339._0_8_ = dVar521;
    auVar339._12_4_ =
         (int)((ulong)(dStack_1b10 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    auVar78._8_4_ = SUB84(dVar429,0);
    auVar78._0_8_ = dVar479;
    auVar78._12_4_ = (uint)((ulong)dVar429 >> 0x20) ^ 0x80000000;
    dStack_1b00 = auVar196._8_8_;
    dVar243 = dVar243 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dVar261 = dStack_1b00 * dStack_1c50;
    auVar79._8_4_ = SUB84(dVar261,0);
    auVar79._0_8_ = dVar243;
    auVar79._12_4_ = (int)((ulong)dVar261 >> 0x20);
    dVar501 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar136 * dStack_1c50;
    dStack_d30 = auVar44._8_8_;
    dVar417 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar125 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar217._8_4_ = SUB84(dVar278,0);
    auVar217._0_8_ = dVar417;
    auVar217._12_4_ = uVar399;
    uStack_13a0 = SUB84(dStack_1a50,0);
    uStack_139c = (undefined4)((ulong)dStack_1a50 >> 0x20);
    auVar218._8_4_ = uStack_13a0;
    auVar218._0_8_ = dVar450;
    auVar218._12_4_ = uStack_139c;
    dVar418 = -(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar526) *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_1bd0 = auVar305._8_8_;
    auVar309._8_4_ = uVar394;
    auVar309._0_8_ = dVar418;
    auVar309._12_4_ = uVar400 ^ 0x80000000;
    dVar542 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar240 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    dVar498 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar249 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    auVar310._8_4_ = uVar397;
    auVar310._0_8_ = dVar572;
    auVar310._12_4_ = uVar434;
    dVar453 = -local_1cb8 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_13e0 = auVar166._8_8_;
    auVar311._8_4_ = uVar384;
    auVar311._0_8_ = dVar453;
    auVar311._12_4_ = uVar398 ^ 0x80000000;
    dVar506 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar507 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar508 = dVar250 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    dStack_1430 = auVar337._8_8_;
    dVar502 = dVar517 * dStack_1430 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar495 = -dVar250 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_14e0 = auVar300._8_8_;
    auVar312._8_4_ = uVar395;
    auVar312._0_8_ = dVar495;
    auVar312._12_4_ = uVar433 ^ 0x80000000;
    dVar476 = dVar357 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    uStack_d10 = SUB84(dVar462,0);
    uStack_d0c = (undefined4)((ulong)dVar462 >> 0x20);
    auVar313._8_4_ = uStack_d10;
    auVar313._0_8_ = dVar476;
    auVar313._12_4_ = uStack_d0c;
    dVar516 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar522;
    dVar517 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar131;
    auVar314._8_4_ = SUB84(dVar517,0);
    auVar314._0_8_ = dVar516;
    auVar314._12_4_ = (int)((ulong)dVar517 >> 0x20);
    dVar477 = dVar583 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    auVar315._8_4_ = SUB84(dVar477,0);
    auVar315._0_8_ = dVar517;
    auVar315._12_4_ = (int)((ulong)dVar477 >> 0x20);
    uStack_1ec0 = auVar52._8_8_;
    local_1ec8 = local_1ec8 *
                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
    auVar316._8_4_ =
         SUB84(uStack_1ec0 *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar316._0_8_ = local_1ec8;
    auVar316._12_4_ =
         (int)((ulong)(uStack_1ec0 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2]) >> 0x20);
    dVar347 = u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * -dVar442 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_14b0 = auVar291._8_8_;
    dVar518 = dVar518 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar128 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1c10 = auVar295._8_8_;
    dVar325 = dVar249 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar321 = dVar438 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar444 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * dVar235 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5];
    dVar430 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dStack_1800 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar349 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar403;
    dVar497 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar403 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5];
    dVar357 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[5] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_1d00 = auVar73._8_8_;
    dVar526 = -dVar245 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5];
    dVar408 = dVar547 * dStack_1d00;
    auVar355._8_4_ = SUB84(dVar408,0);
    auVar355._0_8_ = dVar526;
    auVar355._12_4_ = (int)((ulong)dVar408 >> 0x20);
    auVar80._8_4_ = uVar381;
    auVar80._0_8_ = dVar357;
    auVar80._12_4_ = uVar387;
    dVar408 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar406 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    dStack_1d10 = auVar211._8_8_;
    dVar368 = dVar279 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1d10 = dStack_1d10 *
                  v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    auVar219._8_4_ = SUB84(dStack_1d10,0);
    auVar219._0_8_ = dVar368;
    auVar219._12_4_ = (int)((ulong)dStack_1d10 >> 0x20);
    auVar81._8_4_ = SUB84(dStack_1d10,0);
    auVar81._0_8_ = dVar408;
    auVar81._12_4_ = (int)((ulong)-dStack_1d10 >> 0x20);
    dVar279 = -(dVar402 *
               u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[5]) *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0];
    dVar131 = dVar543 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_1590 = auVar208._8_8_;
    dStack_1610 = auVar62._8_8_;
    dVar135 = dVar274 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar543 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar590 * dStack_1c20;
    auVar82._8_4_ = SUB84(dVar543,0);
    auVar82._0_8_ = dVar135;
    auVar82._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dVar136 = dVar117 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar543 = -dVar580 * dStack_1c20;
    auVar83._8_4_ = SUB84(dVar543,0);
    auVar83._0_8_ = dVar136;
    auVar83._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dStack_fe0 = auVar176._8_8_;
    auVar84._8_4_ = SUB84(dStack_fe0 * dStack_1c20,0);
    auVar84._0_8_ =
         dVar257 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar84._12_4_ = (int)((ulong)(dStack_fe0 * dStack_1c20) >> 0x20);
    dStack_f90 = auVar352._8_8_;
    dVar359 = dVar359 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar85._8_4_ = SUB84(dStack_f90 * dStack_1c20,0);
    auVar85._0_8_ = dVar359;
    auVar85._12_4_ = (int)((ulong)(dStack_f90 * dStack_1c20) >> 0x20);
    dVar239 = -dVar412 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar543 = dVar588 * dStack_1c20;
    auVar86._8_4_ = SUB84(dVar543,0);
    auVar86._0_8_ = dVar239;
    auVar86._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dVar470 = dVar470 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    dVar543 = -(dVar522 *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3]) * dStack_1c20;
    auVar87._8_4_ = SUB84(dVar543,0);
    auVar87._0_8_ = dVar470;
    auVar87._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dStack_1380 = auVar7._8_8_;
    auVar88._8_4_ = SUB84(dStack_1380 * dStack_1c20,0);
    auVar88._0_8_ =
         dVar132 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar88._12_4_ = (int)((ulong)(dStack_1380 * dStack_1c20) >> 0x20);
    dStack_eb0 = auVar143._8_8_;
    dVar230 = dVar230 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar89._8_4_ = SUB84(dStack_eb0 * dStack_1c20,0);
    auVar89._0_8_ = dVar230;
    auVar89._12_4_ = (int)((ulong)(dStack_eb0 * dStack_1c20) >> 0x20);
    auVar90._8_4_ = SUB84(dStack_1360 * dStack_1c20,0);
    auVar90._0_8_ =
         dVar233 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    auVar90._12_4_ = (int)((ulong)(dStack_1360 * dStack_1c20) >> 0x20);
    dStack_1b60 = auVar42._8_8_;
    dVar440 = dVar440 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar91._8_4_ = SUB84(dStack_1b60 * dStack_1c20,0);
    auVar91._0_8_ = dVar440;
    auVar91._12_4_ = (int)((ulong)(dStack_1b60 * dStack_1c20) >> 0x20);
    auVar220._8_4_ = SUB84(dVar344 * dStack_1c20,0);
    auVar220._0_8_ =
         dStack_1590 *
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar220._12_4_ = (int)((ulong)(dVar344 * dStack_1c20) >> 0x20);
    dVar488 = dVar464 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1];
    auVar92._8_4_ = SUB84(-dVar461 * dStack_1c20,0);
    auVar92._0_8_ = dVar488;
    auVar92._12_4_ = (int)((ulong)(-dVar461 * dStack_1c20) >> 0x20);
    dVar533 = -dStack_1d10 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar543 = auVar67._8_8_ * dStack_1c20;
    auVar356._8_4_ = SUB84(dVar543,0);
    auVar356._0_8_ = dVar533;
    auVar356._12_4_ = (int)((ulong)dVar543 >> 0x20);
    dStack_1b00 = auVar79._8_8_;
    dVar243 = dVar243 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar93._8_4_ = SUB84(dStack_1b00 * dStack_1c20,0);
    auVar93._0_8_ = dVar243;
    auVar93._12_4_ = (int)((ulong)(dStack_1b00 * dStack_1c20) >> 0x20);
    dStack_1890 = auVar289._8_8_;
    dVar455 = dVar455 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar94._8_4_ = SUB84(dStack_1890 * dStack_1c20,0);
    auVar94._0_8_ = dVar455;
    auVar94._12_4_ = (int)((ulong)(dStack_1890 * dStack_1c20) >> 0x20);
    auVar95._8_4_ = uVar382;
    auVar95._0_8_ = dVar279;
    auVar95._12_4_ = uVar388;
    dVar583 = dVar227 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar424 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dVar424;
    dVar543 = v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * auVar306._8_8_;
    auVar221._8_4_ = SUB84(dVar543,0);
    auVar221._0_8_ = dVar424;
    auVar221._12_4_ = (int)((ulong)dVar543 >> 0x20);
    auVar96._8_4_ = uVar432;
    auVar96._0_8_ = dVar583;
    auVar96._12_4_ = uVar436;
    dVar461 = dVar227 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_1ac0 = auVar70._8_8_;
    dVar137 = dVar137 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    dStack_1ac0 = dStack_1ac0 *
                  v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    dVar229 = local_1488._8_8_ *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_1ce0 = auVar213._8_8_;
    auVar97._8_4_ =
         SUB84(dStack_1ce0 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3],0);
    auVar97._0_8_ =
         dVar346 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
    auVar97._12_4_ =
         (int)((ulong)(dStack_1ce0 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3]) >> 0x20);
    dStack_1ee0 = auVar214._8_8_;
    dVar437 = dVar437 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar98._8_4_ =
         SUB84(dStack_1ee0 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[3],0);
    auVar98._0_8_ = dVar437;
    auVar98._12_4_ =
         (int)((ulong)(dStack_1ee0 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3]) >> 0x20);
    dVar403 = dVar582 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar222._8_4_ =
         SUB84(dVar516 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[3],0);
    auVar222._0_8_ = dVar403;
    auVar222._12_4_ =
         (int)((ulong)(dVar516 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3]) >> 0x20);
    dVar404 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar524 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[5];
    auVar223._8_4_ = uVar385;
    auVar223._0_8_ = dVar404;
    auVar223._12_4_ = uVar391;
    dVar232 = -local_19b8 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    auVar99._8_4_ = uVar385;
    auVar99._0_8_ = dVar232;
    auVar99._12_4_ = uVar391;
    dVar234 = dVar465 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar235 = -dVar234 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    auVar100._8_4_ = uVar385;
    auVar100._0_8_ = dVar235;
    auVar100._12_4_ = uVar391;
    dVar405 = -local_1488 *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    auVar224._8_4_ = SUB84(dVar426,0);
    auVar224._0_8_ = dVar405;
    auVar224._12_4_ = (int)((ulong)dVar426 >> 0x20);
    dVar534 = -dVar253 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4];
    dStack_1370 = auVar212._8_8_;
    auVar225._8_4_ = uVar383;
    auVar225._0_8_ = dVar534;
    auVar225._12_4_ = uVar393 ^ 0x80000000;
    dVar535 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * dVar253 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar543 = auVar209._8_8_;
    dVar240 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * local_1cb8 *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dVar249 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar250 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] *
              u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1720 = auVar6._8_8_;
    dVar575 = dVar575 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar422 = dStack_1720 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar438 = dStack_1430 *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dVar442 = -dVar438;
    dVar416 = dVar416 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5];
    dStack_1d60 = auVar74._8_8_;
    dVar464 = dStack_1d60 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar317._8_4_ =
         SUB84(dVar138 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1],0);
    auVar317._0_8_ = dVar464;
    auVar317._12_4_ =
         (int)((ulong)(dVar138 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dVar465 = v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * dVar112 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0] *
                    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar252 = dVar593 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar318._8_4_ = SUB84(dVar252,0);
    auVar318._0_8_ = dVar465;
    auVar318._12_4_ = (int)((ulong)dVar252 >> 0x20);
    dVar252 = dVar575 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    dVar253 = dVar422 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar101._8_4_ = SUB84(dVar253,0);
    auVar101._0_8_ = dVar252;
    auVar101._12_4_ = (int)((ulong)dVar253 >> 0x20);
    dStack_1700 = auVar43._8_8_;
    auVar102._8_4_ =
         SUB84(dStack_1e50 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar102._0_8_ =
         dStack_1700 *
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    auVar102._12_4_ =
         (int)((ulong)(dStack_1e50 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    dVar253 = -dStack_1880 *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dVar254 = dVar428 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    auVar103._8_4_ = SUB84(dVar254,0);
    auVar103._0_8_ = dVar253;
    auVar103._12_4_ = (int)((ulong)dVar254 >> 0x20);
    dVar525 = -dVar461;
    dStack_f20 = auVar149._8_8_;
    dStack_f20 = dStack_f20 * dStack_1ca0;
    auVar340._8_4_ = SUB84(dStack_f20,0);
    auVar340._0_8_ = dVar525;
    auVar340._12_4_ = (int)((ulong)dStack_f20 >> 0x20);
    dVar254 = dVar238 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    auVar104._8_4_ =
         SUB84(dStack_f20 *
               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[1],0);
    auVar104._0_8_ = dVar254;
    auVar104._12_4_ =
         (int)((ulong)(dStack_f20 *
                      v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1]) >> 0x20);
    auVar105._8_4_ = uVar380;
    auVar105._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar105._12_4_ = uVar386;
    auVar106._8_4_ = SUB84(dStack_1ac0,0);
    auVar106._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    auVar106._12_4_ = (int)((ulong)dStack_1ac0 >> 0x20);
    dStack_14a0 = auVar82._8_8_;
    dStack_17d0 = auVar68._8_8_;
    dStack_1a00 = auVar83._8_8_;
    dStack_18f0 = auVar66._8_8_;
    dVar515 = dVar544 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    dStack_17e0 = auVar204._8_8_;
    dStack_1060 = auVar215._8_8_;
    dStack_1d10 = auVar219._8_8_;
    dStack_1a10 = auVar75._8_8_;
    dVar238 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar113 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dVar113 = dVar129 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2];
    dStack_880 = auVar35._8_8_;
    dVar129 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * dVar402 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    dStack_1b20 = auVar189._8_8_;
    dVar264 = dVar264 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar107._8_4_ =
         SUB84(dStack_1b20 *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar107._0_8_ = dVar264;
    auVar107._12_4_ =
         (int)((ulong)(dStack_1b20 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2]) >> 0x20);
    dVar125 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * dVar125 *
              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    dStack_1750 = auVar51._8_8_;
    dStack_1cd0 = auVar205._8_8_;
    dVar472 = dVar472 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2];
    auVar108._8_4_ =
         SUB84(dStack_1cd0 *
               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array[2],0);
    auVar108._0_8_ = dVar472;
    auVar108._12_4_ =
         (int)((ulong)(dStack_1cd0 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2]) >> 0x20);
    dStack_d00 = auVar22._8_8_;
    dStack_1ce0 = auVar97._8_8_;
    dStack_990 = auVar225._8_8_;
    dStack_1e90 = auVar64._8_8_;
    dStack_13e0 = dStack_13e0 * dStack_1e90;
    dStack_1790 = auVar314._8_8_;
    auVar109._8_4_ = SUB84(dStack_1e90 * dStack_1790,0);
    auVar109._0_8_ =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] *
         dVar516;
    auVar109._12_4_ = (int)((ulong)(dStack_1e90 * dStack_1790) >> 0x20);
    dStack_15e0 = auVar63._8_8_;
    dStack_7b0 = auVar23._8_8_;
    auVar110._8_4_ = SUB84(dVar574,0);
    auVar110._0_8_ = dVar543;
    auVar110._12_4_ = (int)((ulong)dVar574 >> 0x20);
    dStack_870 = auVar36._8_8_;
    dStack_1d70 = auVar210._8_8_;
    dStack_1160 = auVar216._8_8_;
    dStack_1280 = auVar310._8_8_;
    dStack_1120 = auVar76._8_8_;
    dStack_13f0 = auVar207._8_8_;
    dStack_fe0 = auVar84._8_8_;
    dStack_1270 = auVar311._8_8_;
    uStack_1cb0 = auVar296._8_8_;
    dStack_fb0 = auVar172._8_8_;
    dStack_1b20 = auVar107._8_8_;
    dStack_1260 = auVar312._8_8_;
    dStack_f90 = auVar85._8_8_;
    dStack_1490 = auVar293._8_8_;
    dStack_17f0 = auVar71._8_8_;
    dStack_1650 = auVar313._8_8_;
    dStack_1100 = auVar78._8_8_;
    dStack_1640 = auVar315._8_8_;
    uStack_1ec0 = auVar316._8_8_;
    dStack_1b80 = auVar86._8_8_;
    dStack_1770 = auVar72._8_8_;
    dStack_1c80 = auVar355._8_8_;
    dStack_790 = auVar161._8_8_;
    dStack_13d0 = auVar167._8_8_;
    dStack_1800 = auVar217._8_8_;
    dStack_fd0 = auVar33._8_8_;
    dStack_780 = auVar164._8_8_;
    dStack_1d60 = auVar317._8_8_;
    dStack_15b0 = auVar81._8_8_;
    dStack_1980 = auVar184._8_8_;
    dStack_1ee0 = auVar98._8_8_;
    dStack_1910 = auVar222._8_8_;
    dStack_1570 = auVar87._8_8_;
    dStack_1ef0 = auVar318._8_8_;
    dStack_810 = auVar288._8_8_;
    dStack_1df0 = auVar110._8_8_;
    dStack_1410 = auVar218._8_8_;
    dStack_1440 = auVar309._8_8_;
    dStack_750 = auVar156._8_8_;
    dStack_1af0 = auVar299._8_8_;
    dStack_1660 = auVar80._8_8_;
    dStack_1670 = auVar95._8_8_;
    dStack_12f0 = auVar96._8_8_;
    dStack_1d40 = auVar340._8_8_;
    dStack_12b0 = auVar88._8_8_;
    dStack_1430 = auVar101._8_8_;
    uVar573 = (ulong)DAT_003b90b0;
    uVar581 = DAT_003b90b0._8_8_;
    dStack_1cd0 = auVar108._8_8_;
    dStack_d20 = auVar178._8_8_;
    dStack_1cf0 = auVar206._8_8_;
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
         dVar330 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
         dVar561 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         dVar414 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         (double)((ulong)dVar229 ^ uVar573) *
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
         (double)((ulong)dVar566 ^ uVar573) *
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
         dVar137 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         dVar472 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         dVar513 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         dVar252 + dVar132 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   dVar525 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   dVar583 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   dVar279 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   dVar357 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   dVar527 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   local_15f8 *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   dVar418 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] +
                   dVar450 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] +
                   dVar415 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   ((-dVar236 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] +
                    dVar444 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    dVar321 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5] * dVar586 +
                    dVar325 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    -dVar445 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
                    dVar125 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] +
                    ((dVar139 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                     dVar250 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] +
                     dVar128 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                     -dVar518 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] +
                     dVar526 + dVar537 * v3.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[2] +
                               dVar347 * v3.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[2] +
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] * dVar140 *
                               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5] +
                               dVar239 + local_1ec8 *
                                         v3.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[2] +
                                         dStack_1640 * dStack_1780 +
                                         ((dVar479 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[5] +
                                          dVar115 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                          dVar476 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                          dVar446 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[5] +
                                          dVar486 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                          dVar359 + dVar495 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar508 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar249 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar507 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar264 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  -dVar506 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  -dVar240 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar560 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar529 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar453 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar257 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  -dVar129 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar333 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  ((dVar131 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  -dVar439 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar247 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar572 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar335 + dVar498 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar113 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar345 +
                                                  dVar119 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar543 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar421 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar514 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar541 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  dVar447 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar535 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar534 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar346 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  ((dVar467 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar368 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  -dVar556 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar141 + dVar466 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar536 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar136 + dStack_17d0 *
                                                            v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  ((v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] * dVar468 +
                                                  dVar540 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar280 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  dVar494 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  -dVar571 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dStack_15c0 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar545 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar570 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar569 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar546 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  ((-dVar473 *
                                                    v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar275 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar493 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar272 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar271 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar116 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar475 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] * -dVar492 +
                                                  dVar269 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar591 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar558 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  -dVar452 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar448 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar409 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar474 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar538 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar511 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  -dVar451 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar557 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar370 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar530 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar259 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] + dVar504) -
                                                  dVar568 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2])) - dVar135)) -
                                                  dVar542 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2]) +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] * -dVar487 +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] * dVar531) -
                                                  dVar349 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4])) -
                                         dVar416 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1]) + dVar246) -
                    dVar417 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[5]) + dVar248) -
                   dVar497 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2]) +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * dVar410 + dVar242;
    dVar116 = auVar298._8_8_ *
              v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] + dVar552 * dStack_1e30 +
                    dVar426 * dStack_1780 +
                    dStack_1cf0 * dStack_1780 +
                    dStack_d20 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
                    dStack_1ac0 * dStack_1780 +
                    dStack_1cd0 * dStack_1e30 +
                    dVar519 * uStack_1740 +
                    dStack_1430 +
                    dStack_12b0 +
                    dStack_1d40 * dStack_1c70 +
                    dStack_12f0 * uStack_1740 +
                    dStack_1670 * dStack_1780 +
                    dStack_1660 * dStack_1ba0 +
                    dStack_1af0 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
                    uStack_15f0 * dStack_1e30 +
                    dStack_1440 * dStack_1770 +
                    dStack_1410 * dStack_1770 +
                    dVar427 * dStack_1c70 +
                    ((dVar523 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[4] +
                     dVar430 * dStack_1780 +
                     dVar124 * dStack_1ba0 +
                     dStack_17f0 * dStack_fd0 +
                     -dVar428 * dStack_1c70 +
                     dVar478 * dStack_1780 +
                     -dStack_1750 *
                     v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[4] +
                     ((dStack_1700 * dStack_1c70 +
                      dVar463 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0] +
                      dStack_1c10 * dStack_1780 +
                      dStack_13d0 * dStack_1ba0 +
                      dStack_1c80 +
                      dStack_14b0 * dStack_1c70 +
                      -dVar261 * dStack_1780 +
                      dStack_1c50 * dStack_d30 * dStack_1770 +
                      dStack_1b80 +
                      uStack_1ec0 * dStack_1ba0 +
                      dVar517 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                      ((dStack_1100 * dStack_17f0 +
                       auVar67._8_8_ * dStack_1780 +
                       dStack_1650 * dStack_1ba0 +
                       dVar482 * dStack_17f0 +
                       dStack_1490 *
                       v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
                       dStack_f90 +
                       dStack_1260 * dStack_1780 +
                       -dVar502 * dStack_1ba0 +
                       dVar442 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                       dVar344 * dStack_1780 +
                       dStack_1b20 * dStack_1e30 +
                       dStack_fb0 *
                       v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] * dStack_1780 +
                       uStack_1cb0 *
                       v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] +
                       dStack_1b10 * dStack_1e30 +
                       dVar548 * dStack_1780 +
                       dStack_1270 * dStack_1780 +
                       dStack_fe0 +
                       dStack_13f0 * dStack_1e20 +
                       dStack_1120 +
                       ((dStack_1610 * dStack_1c20 +
                        dVar401 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2] +
                        dStack_880 * dStack_1e20 +
                        dStack_1280 * dStack_1ba0 +
                        dStack_1160 +
                        dStack_18e0 * dStack_1c70 +
                        dVar501 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[3] +
                        v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] * dStack_1d70 +
                        dStack_870 * dStack_1e20 +
                        dVar574 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] +
                        dStack_7b0 * dStack_1e30 +
                        dVar520 * dStack_1ba0 +
                        dVar593 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[1] +
                        dVar522 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[3] * dStack_1780 +
                        -dVar516 * dStack_15e0 +
                        dStack_990 *
                        v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
                        dStack_1ce0 +
                        ((dVar481 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[4] +
                         dStack_1d10 * dStack_1e20 +
                         dVar238 * dStack_1c70 +
                         dStack_1a10 +
                         dVar480 * dStack_1e20 +
                         dStack_1070 *
                         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4] * dStack_1c70 +
                         dStack_1a00 +
                         dVar420 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[3] +
                         ((v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[2] * dVar590 *
                           v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[4] +
                          dVar585 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[4] * dStack_1780 +
                          dStack_12a0 *
                          v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[4] +
                          dStack_1950 *
                          v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] +
                          dVar276 * dStack_1c20 +
                          dVar587 * dStack_1ba0 +
                          dVar407 * dStack_1c70 +
                          dVar579 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[2] +
                          dVar578 * dStack_1ba0 +
                          dVar489 + ((v2.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[1] * dVar503 *
                                      v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[0] +
                                     dVar471 + dStack_1630 *
                                               v3.
                                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[2] +
                                               dVar262 + dVar505 + dStack_1190 *
                                                                   v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  -dVar267 * dStack_19a0 +
                                                  -dVar512 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  dVar263 + -dVar469 *
                                                            v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar564 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar334 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dStack_17c0 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar425 * dStack_1c70 +
                                                  -dVar233 * dStack_1ba0 +
                                                  -dVar361 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar483 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar270 * dStack_1c70 +
                                                  dVar563 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar371 * dStack_19a0 +
                                                  dVar549 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] + dStack_1f20) -
                                    dVar577 * dStack_1c70)) - dStack_14a0)) -
                        dStack_d00 * dStack_1780) +
                        dVar576 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4] +
                        dVar592 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4]) - dStack_1b60 * dStack_1e90)) -
                      dVar127 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0]) + dStack_790) - dStack_1800 * dStack_17f0
                     ) + dStack_780) -
                    local_1868 *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[4] * dStack_1780) +
                    dVar499 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] + dStack_750;
    auVar341._8_4_ = SUB84(dVar116,0);
    auVar341._0_8_ =
         factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
         [0];
    auVar341._12_4_ = (int)((ulong)dVar116 >> 0x20);
    dStack_860 = auVar45._8_8_;
    dStack_18e0 = auVar77._8_8_;
    dStack_1a20 = auVar302._8_8_;
    dStack_eb0 = auVar89._8_8_;
    dStack_1360 = auVar90._8_8_;
    dStack_1b60 = auVar91._8_8_;
    dStack_1e50 = auVar102._8_8_;
    dStack_840 = auVar175._8_8_;
    dStack_1d80 = auVar339._8_8_;
    dStack_1610 = auVar220._8_8_;
    dStack_f80 = auVar92._8_8_;
    dStack_1150 = auVar356._8_8_;
    dStack_1e90 = auVar109._8_8_;
    dStack_1b00 = auVar93._8_8_;
    dStack_770 = auVar160._8_8_;
    dStack_13c0 = auVar174._8_8_;
    dStack_1890 = auVar94._8_8_;
    dStack_1db0 = auVar103._8_8_;
    dStack_760 = auVar163._8_8_;
    dStack_ce0 = auVar21._8_8_;
    dStack_730 = auVar147._8_8_;
    dStack_ed0 = auVar16._8_8_;
    dStack_1880 = auVar69._8_8_;
    dStack_1b70 = auVar221._8_8_;
    dStack_f20 = auVar104._8_8_;
    dStack_1380 = auVar105._8_8_;
    dStack_1560 = auVar223._8_8_;
    dStack_1ac0 = auVar106._8_8_;
    uStack_19b0 = auVar99._8_8_;
    dStack_1500 = auVar224._8_8_;
    dStack_1840 = auVar100._8_8_;
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         dVar235 + v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * dVar234 *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   dVar405 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   dVar343 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * dVar258 +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * dVar232 +
                   (double)((ulong)(dVar423 *
                                   u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[5]) ^ uVar573) *
                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   dVar423 * u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   -(dVar524 *
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[5]) *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * dVar404 +
                   dVar254 + dVar424 + v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[1] * dVar133 +
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] * dVar118 +
                                       (double)((ulong)dVar459 ^ uVar573) *
                                       v1.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] *
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                                       dVar120 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[2] +
                                       dVar122 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[2] +
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] * dVar324 *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                                       -dVar130 *
                                       u3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] *
                                       v1.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] *
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                                       -dVar483 *
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] +
                                       dStack_1b30 *
                                       v1.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] *
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                                       uStack_1860 *
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] * dVar237 +
                                       dVar509 * v2.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[2] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[5] +
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] * dStack_ce0 +
                                       dVar367 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[2] +
                                       (double)((ulong)dStack_d30 ^ uVar573) *
                                       v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[1] *
                                       v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                                       dVar253 + dVar455 + dVar127 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar241 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar112 * u2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar582 * u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar256 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar589 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar323 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] *
                                                  u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar485 *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar319 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar243 + (double)((ulong)dVar413 ^ uVar573) *
                                                            v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] * dVar413 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  (double)((ulong)dVar522 ^ uVar573) *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar516 +
                                                  dVar265 * v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] *
                                                  dVar406 * v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar533 + dVar544 * u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  -dVar420 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  dStack_fd0 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar488 + dVar454 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] *
                                                  -dVar342 *
                                                  u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar539 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dStack_1590 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar460 * v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] * dVar584 *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] * dVar328 +
                                                  dVar521 + (double)((ulong)(v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar441) ^ uVar573) *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar251 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  -dVar278 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar327 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dStack_1700 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar440 + dVar233 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar230 + -auVar58._8_8_ *
                                                            v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar332 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar329 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar562 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar255 *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  (double)((ulong)(v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar509) ^ uVar573) *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar134 * u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar496 + dVar528 * v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar449 * v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar326 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar442 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar465 + dVar470 + dVar403 + dVar500 * v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar437 + dVar419 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar443 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  dVar408 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar481 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar464 + -dVar138 *
                                                            v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  -dVar544 *
                                                  u3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] *
                                                  v1.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  -dVar590 *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  dVar320 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] * dVar585 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  ((v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] * dVar515 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                  -dVar515 *
                                                  v2.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                                  dVar407 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                  -dVar577 *
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] + dVar114) -
                                                  dVar565 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3]);
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
         auVar298._8_8_ * dStack_1840 +
         dVar552 * dStack_1e30 +
         dStack_1500 * dStack_1780 +
         dStack_1cf0 * dStack_1780 +
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
         dStack_d20 +
         dStack_1ac0 * uStack_19b0 +
         dStack_1cd0 * dStack_1c70 +
         dVar519 * uStack_1740 +
         dVar422 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         dStack_1380 * dStack_1560 +
         dStack_f20 +
         dStack_1b70 +
         dStack_1c20 * auVar10._8_8_ +
         dStack_1d00 * auVar9._8_8_ +
         (double)((ulong)dStack_1af0 ^ uVar581) * dStack_1780 +
         dStack_1880 * dStack_1c70 +
         dStack_ed0 * dStack_1780 +
         dStack_1bd0 * dStack_1780 +
         dVar499 * dStack_1780 +
         dStack_1a50 * dStack_1770 +
         (double)((ulong)dVar427 ^ uVar581) * dStack_1c70 +
         local_1868 *
         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] *
         dStack_1780 +
         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] *
         dStack_730 +
         dVar430 * dStack_1770 +
         dStack_1ba0 * dVar124 +
         dStack_760 * uStack_1740 +
         (double)CONCAT44(uVar392 ^ DAT_003b90b0._12_4_,uVar390 ^ DAT_003b90b0._8_4_) * dStack_1c70
         + dStack_1db0 +
           dStack_1890 +
           dStack_1750 *
           v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
           + dStack_13c0 * dStack_1c70 +
             (double)((ulong)dStack_1700 ^ uVar581) * dStack_1e30 +
             dVar463 * dStack_1ba0 +
             dStack_1c10 * dStack_1780 +
             dStack_13d0 * dStack_1ba0 +
             dStack_770 * uStack_1740 +
             dVar547 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] +
             dStack_14b0 * dStack_1e30 +
             dStack_1b00 +
             (double)((ulong)(dStack_1c50 * dStack_d30) ^ uVar581) * dStack_1780 +
             -dVar588 *
             v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] + (double)((ulong)uStack_1ec0 ^ uVar581) * dStack_1ba0 +
                   dStack_1e90 +
                   dVar127 * dStack_1ba0 +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * dVar429 +
                   dStack_1150 +
                   dVar462 * dStack_1ba0 +
                   dVar482 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   (double)((ulong)dStack_1490 ^ uVar581) *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   dStack_f80 +
                   dStack_14e0 * dStack_1c20 +
                   dVar502 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   dVar438 * dStack_1e30 +
                   dStack_1610 +
                   (double)((ulong)dStack_1b20 ^ uVar581) * dStack_1c70 +
                   dStack_fb0 *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * dStack_1780 +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * uStack_1cb0 +
                   dStack_1d80 +
                   (double)((ulong)dVar548 ^ uVar581) * dStack_1780 +
                   dStack_13e0 +
                   dStack_840 *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   dStack_13f0 * dStack_1e20 +
                   dStack_1e50 +
                   dStack_1b60 +
                   dStack_1360 +
                   dStack_eb0 +
                   dStack_880 * dStack_1e20 +
                   dStack_1a20 * dStack_1e20 +
                   uStack_1400 * dStack_1c70 +
                   dStack_18e0 +
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * dVar501 +
                   dStack_1d70 *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] +
                   dVar592 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] +
                   dStack_860 +
                   dVar319 * dStack_1ba0 +
                   -dStack_1df0 * dStack_1ba0 +
                   dStack_810 * dStack_1c70 +
                   dVar520 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   dStack_1ef0 +
                   dStack_1570 +
                   dStack_1910 +
                   dStack_1370 * dStack_1780 +
                   dStack_1ee0 +
                   dStack_d00 * dStack_1780 +
                   dStack_1980 +
                   dStack_15b0 * dStack_1ba0 +
                   -dVar238 *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   dStack_1d60 +
                   dVar480 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   dStack_1070 *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * dStack_1e30 +
                   dVar580 * dStack_1780 +
                   dStack_1060 * dStack_19a0 +
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * dVar590 * dStack_1780 +
                   ((-(dVar585 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4]) * dStack_1780 +
                    dVar565 * dStack_17e0 +
                    dStack_1b50 *
                    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] +
                    dVar276 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] + dStack_18f0) -
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * dVar590 *
                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4]);
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
         dVar330 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
         dVar561 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         ((dVar229 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] +
          dVar566 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] +
          dVar137 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
          ((dVar513 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] +
           dVar575 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[0] +
           dVar132 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[1] +
           dVar461 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] +
           ((dVar279 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
            dVar357 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] +
            dVar527 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] +
            local_15f8 *
            v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            [1] + dVar121 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[0] +
                  dVar418 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[5] +
                  dVar410 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[1] +
                  dVar450 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[5] +
                  ((dVar497 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                   dVar236 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   (((dVar277 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0] +
                     ((dVar325 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                      dVar445 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                      ((dVar417 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[5] +
                       dVar139 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                       ((dVar128 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2] +
                        dVar518 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2] +
                        ((dVar245 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[5] +
                         dVar537 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2] +
                         dVar347 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2] +
                         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] * dVar140 *
                         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[5] +
                         dVar412 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] +
                         local_1ec8 *
                         v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] +
                         ((dVar416 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[1] +
                          ((dVar115 * v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[2] +
                           dVar476 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[2] +
                           dVar446 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[5] +
                           ((dVar358 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[1] +
                            dVar495 * v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[2] +
                            dVar508 * v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[2] +
                            dVar249 * v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[0] +
                            ((dVar264 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                        .m_storage.m_data.array[1] +
                             dVar506 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                             dVar240 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[0] +
                             ((dVar529 * v3.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[2] +
                              dVar453 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                        .m_storage.m_data.array[2] +
                              ((dVar129 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[1] +
                               ((dVar349 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[4] +
                                dVar131 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[1] +
                                dVar439 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[0] +
                                ((dVar572 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[2] +
                                 dVar126 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[4] +
                                 dVar498 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[2] +
                                 dVar113 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                 dVar345 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[4] +
                                 dVar531 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 dVar487 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[2] +
                                 dVar119 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                 ((v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] * dVar244 *
                                   v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] +
                                  dVar514 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[2] +
                                  dVar541 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[4] +
                                  dVar447 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[2] +
                                  dVar535 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[0] +
                                  dVar534 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[0] +
                                  ((dVar542 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[2] +
                                   ((dVar368 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[1] +
                                    dVar556 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[2] +
                                    ((dVar466 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[1] +
                                     ((dVar117 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[1] +
                                      dVar532 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[4] +
                                      dVar274 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[1] +
                                      dVar468 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[1] +
                                      ((dVar260 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[4] +
                                       ((dVar571 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                        dStack_15c0 *
                                        v3.
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                        .m_storage.m_data.array[2] +
                                        dVar545 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                        dVar570 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                        ((dVar546 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                         dVar568 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                         dVar473 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                         ((dVar493 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                          dVar272 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                          ((dVar559 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                           ((dVar492 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                            dVar269 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                            dVar591 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                            dVar558 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                            dVar452 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                            ((dVar409 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                             dVar474 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                             dVar538 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                             dVar511 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                             dVar451 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                             dVar557 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                             dVar370 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                             ((dVar259 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                              v2.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[3] * dVar491 *
                                              v3.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[2] +
                                              ((dVar411 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                               ((dVar331 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                ((dVar231 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                 dVar510 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                 dVar490 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                                 dVar369 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                 dVar228 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                 dVar553 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                                 ((dVar555 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar266 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  dVar348 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                                  (dVar484 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] -
                                                  v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] * dVar322)) -
                                                 dVar567 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2])) -
                                                dVar268 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0])) -
                                               dVar360 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2])) -
                                              dVar273 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3])) -
                                             dVar530 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0])) -
                                            dVar448 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1])) -
                                           dVar475 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3])) -
                                          dVar271 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0])) -
                                         dVar275 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1])) -
                                        dVar569 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2])) -
                                       dVar494 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[0])) -
                                      dVar540 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[2])) -
                                     dVar536 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[2])) -
                                    dVar554 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[4])) -
                                   dVar467 * v3.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1])) -
                                  dVar346 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[2])) -
                                 dVar543 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0])) -
                                dVar247 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[1])) -
                               v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[4] * dVar333)) -
                              dVar257 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                        .m_storage.m_data.array[1])) -
                             dVar560 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[1])) -
                            dVar507 * v3.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[2])) -
                           dVar486 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[0])) -
                          dVar479 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[5])) -
                         dVar477 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2])) -
                        dVar123 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0])) -
                       dVar250 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0])) -
                      dVar125 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1])) -
                     dVar586 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5])) -
                    dVar321 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2]) -
                   dVar444 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2])) -
                  dVar415 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[2])) -
           dVar583 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2])) -
          dVar472 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1])) -
         dVar414 * v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2]);
    dStack_1e80 = auVar341._8_8_;
    factors.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
         dStack_1e80;
    o4_roots<double>(&realRoots,&factors);
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dVar543 = -local_1488._8_8_ *
              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar573 = (ulong)((long)realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
    while (iVar376 = (int)uVar573, uVar573 = (ulong)(iVar376 - 1), iVar376 != 0) {
      dVar112 = realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      auVar457._0_8_ = 1.0 - dVar112 * dVar112;
      dVar113 = dVar112 * dVar112 + 1.0;
      auVar457._8_8_ = dVar112 + dVar112;
      auVar226._8_4_ = SUB84(dVar113,0);
      auVar226._0_8_ = dVar113;
      auVar226._12_4_ = (int)((ulong)dVar113 >> 0x20);
      auVar458 = divpd(auVar457,auVar226);
      local_e08 = auVar458._0_8_;
      dVar277 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] * local_e08;
      b = auVar458._8_8_;
      dVar544 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                local_e08 *
                -u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
      dVar118 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar544;
      dVar574 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar277;
      dVar133 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * -local_e08 *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
      dVar554 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * local_e08;
      dVar119 = -dVar554 *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
      dVar319 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar277;
      dVar419 = -local_e08 *
                u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
      dVar544 = dVar544 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      dVar420 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * b;
      dVar132 = -dVar420 *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
      dVar559 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * b;
      dVar276 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar559;
      dVar586 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] * b;
      dVar478 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar586;
      dVar112 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * -dVar586;
      dVar587 = -dVar586 *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4];
      local_e38 = -b;
      dVar421 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * local_e38 *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
      dVar120 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * b *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
      dVar559 = dVar559 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      dVar575 = b * local_e08;
      dVar518 = local_e08 * local_e08;
      dVar113 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar518;
      dVar121 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar113;
      dVar129 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar518;
      dVar122 = b * b;
      dVar114 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar122;
      dVar115 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar122;
      dVar560 = v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar115;
      dVar275 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar575;
      dVar134 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar275;
      dVar461 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar275;
      dVar123 = -dVar275 *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
      dVar545 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * dVar275 *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
      dVar275 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar575;
      dVar454 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar275;
      dVar116 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar275 *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
      dVar473 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
                u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar575;
      dVar546 = u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * dVar575 *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
      dVar553 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
                dVar575 * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[4];
      dVar504 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar275;
      dVar124 = dVar275 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[4] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
      dVar275 = -(dVar575 *
                 u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4]) *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1];
      dVar554 = dVar554 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      dVar420 = dVar420 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      dVar575 = ((((dVar574 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2] +
                   dVar554 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   dVar544 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   (v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar402 *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[1] -
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   dVar402 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1])) -
                  v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * dVar319 *
                  v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2]) +
                 dVar420 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[0]) -
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * dVar478 *
                v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2]) +
                dVar559 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1] +
                dVar112 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1] *
                v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2] +
                dVar121 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      dVar562 = -dVar129 *
                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
      dVar117 = u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * dVar114 *
                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[2];
      dVar455 = dVar117 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      dVar524 = dVar560 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2];
      tx = -(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * dVar275 *
             v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] + dVar124 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   ((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] * dVar504 *
                     v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[4] +
                    (((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[1] * dVar473 *
                       v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
                      dVar116 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0] +
                      ((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] * dVar454 *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] +
                       dVar545 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] +
                       dVar123 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                       ((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] * dVar461 *
                         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[3] +
                        v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * dVar134 *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
                        -dVar134 *
                        v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] +
                        u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
                        dVar122 * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4] *
                        v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
                        (((u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[3] * dVar115 *
                           v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[2] *
                           v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[1] +
                          u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1] * dVar115 *
                          v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3] *
                          v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2] +
                          ((dVar560 * v2.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[4] +
                           ((u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] *
                             dVar518 * u1.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[4] *
                             v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] *
                             v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                            v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[4] *
                            u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[0] * dVar129 *
                            v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[2] +
                            (((u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] *
                               u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3] * dVar518 *
                               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                              ((u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0] * dVar113 *
                                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[3] *
                                v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                               (((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[5] * dVar112 *
                                  v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2] +
                                 u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] * b *
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 dVar559 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[5] +
                                 dVar120 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 dVar421 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar587 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] *
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] * dVar586 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar112 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar478 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[4] +
                                 dVar276 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 dVar132 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] *
                                 u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] * local_e08 *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] * dVar574 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 local_e08 *
                                 -u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] *
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 dVar544 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[5] +
                                 dVar419 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] *
                                 dVar277 * u2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[4] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar319 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[4] +
                                 dVar119 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 dVar133 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] *
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] * dVar277 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar574 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] +
                                 dVar118 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 dVar543 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[0] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar227 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] * dVar402 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] +
                                 -dVar402 *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0]) -
                                u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1] *
                                u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[5] * b *
                                v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] *
                                v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2]) -
                               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] *
                               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] * dVar113 *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3])) -
                              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] * dVar113 *
                              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] *
                              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0])) -
                             dVar121 * v2.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[4]) -
                            dVar113 * u2.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[4] *
                            v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[2] *
                            v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[1])) -
                           v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[4] *
                           u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[1] * dVar114 *
                           v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[2])) -
                          v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2] *
                          u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1] * dVar115 *
                          v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3])) -
                         dVar115 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[4] *
                         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] *
                         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0]) -
                        u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
                        u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] * dVar122 *
                        v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2])) -
                       v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3] * dVar461 *
                       v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2])) -
                      v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] * dVar454 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2])) -
                     v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[0] * dVar546 *
                     v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2]) -
                    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[0] * dVar553 *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2])) -
                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * dVar504 *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2])) /
           (((dVar575 -
             u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * dVar129 *
             v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2]) + dVar455) - dVar524);
      ty = -(dVar275 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] *
             v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] + dVar553 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   dVar546 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] *
                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   dVar124 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   (((v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] * dVar504 *
                      v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] +
                     dVar454 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[4] *
                     v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] +
                     (((dVar461 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
                       ((dVar473 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] *
                         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2] +
                        dVar123 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] +
                        dVar134 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[3] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
                        -dVar134 *
                        v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] +
                        ((u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3] * dVar122 *
                          u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] *
                          v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1] *
                          v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2] +
                         ((dVar114 * u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                     .m_storage.m_data.array[4] *
                           v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[2] *
                           v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[0] +
                          ((dVar117 * v2.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[3] +
                           u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[0] * dVar114 *
                           v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[4] *
                           v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[2] +
                           ((dVar518 * u1.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[4] *
                             u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] *
                             v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] *
                             v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                            ((u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] * dVar129 *
                              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] *
                              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                             ((u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3] * dVar518 *
                               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[1] *
                               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                              ((dVar562 * v2.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[3] +
                               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[1] * dVar113 *
                               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3] *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                               u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5] * b *
                               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] *
                               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                               dVar478 * v1.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[5] *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                               (((dVar120 * v2.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[1] +
                                 dVar421 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                 dVar587 * v1.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] +
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] * dVar586 *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                                 dVar112 * v1.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] +
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] * dVar478 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[4] +
                                 dVar276 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                 dVar132 * v2.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                 u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] * local_e08 *
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 dVar319 * v1.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[5] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                                 (((dVar419 * v2.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[1] +
                                   dVar277 * u2.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[4] *
                                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] +
                                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] * dVar319 *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[4] +
                                   dVar119 * v2.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] +
                                   dVar133 * v2.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] +
                                   u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[3] * dVar277 *
                                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                                   dVar574 * v1.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[3] +
                                   dVar118 * v2.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] +
                                   dVar543 * v2.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] +
                                   dVar227 * v1.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2] +
                                   dVar402 * v1.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[5] +
                                   -dVar402 *
                                   v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[5] *
                                   v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1]) -
                                  dVar554 * v2.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[5]) -
                                 u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] * local_e08 *
                                 u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] *
                                 v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] *
                                 v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2])) -
                                dVar420 * v2.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[5]) -
                               u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] * b *
                               u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5] *
                               v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] *
                               v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2])) -
                              u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] * dVar129 *
                              v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] *
                              v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0])) -
                             v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] *
                             u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] * dVar129 *
                             v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4])) -
                            dVar129 * u2.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                      m_storage.m_data.array[4] *
                            v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[2] *
                            v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[1])) -
                           v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[2] *
                           u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[0] * dVar114 *
                           v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                           .m_data.array[4])) -
                          u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3] * dVar114 *
                          v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2] *
                          v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1])) -
                         u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] * dVar115 *
                         v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[3] *
                         v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2])) -
                        dVar122 * u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4] *
                        u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
                        v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
                        v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2])) -
                       v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] * dVar461 *
                       v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4])) -
                      dVar545 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1]) -
                     v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[2] * dVar454 *
                     v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                     m_data.array[4])) -
                    dVar504 * v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] *
                    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                    .array[2]) -
                   dVar116 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1])) /
           ((dVar562 * v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] + dVar575 + dVar455) - dVar524);
      local_e30.m_row = 0;
      realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      local_e30.m_col = 1;
      local_e30.m_currentBlockRows = 1;
      local_e30.m_xpr = &transOut;
      transOut.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = local_e08;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (&local_e30,&local_e38);
      local_e40 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e40);
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&tx);
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&b);
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e08);
      local_e48 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e48);
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&ty);
      local_e50 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e50);
      local_e58 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e58);
      local_e60 = 1.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e60);
      local_e68 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e68);
      local_e70 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e70);
      local_e78 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e78);
      local_e80 = 0.0;
      pCVar372 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar372,&local_e80);
      local_e88 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar372,&local_e88)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(&local_e30);
      local_e30.m_xpr = &TV;
      local_e30.m_col = (Index)&TU;
      local_e30.m_row = (Index)&transOut;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                (&transOut,
                 (Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
                  *)&local_e30);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,&transOut);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&realRoots.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_6f0);
    return __return_storage_ptr__;
  }
  poVar373 = std::operator<<((ostream *)&std::cerr,
                             "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
  std::endl<char,std::char_traits<char>>(poVar373);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}